

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_predict_intra_block
               (MACROBLOCKD *xd,BLOCK_SIZE sb_size,int enable_intra_edge_filter,int wpx,int hpx,
               TX_SIZE tx_size,PREDICTION_MODE mode,int angle_delta,int use_palette,
               FILTER_INTRA_MODE filter_intra_mode,uint8_t *ref,int ref_stride,uint8_t *dst,
               int dst_stride,int col_off,int row_off,int plane)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  MB_MODE_INFO *pMVar10;
  scale_factors *psVar11;
  scale_factors *psVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  intra_pred_fn (*pap_Var61) [19];
  intra_high_pred_fn (*pap_Var62) [19];
  char cVar63;
  byte bVar64;
  byte bVar65;
  uint16_t uVar66;
  uint uVar67;
  int iVar68;
  int iVar69;
  uint16_t *puVar70;
  byte bVar71;
  long lVar72;
  size_t __n;
  ulong uVar73;
  long lVar74;
  byte *pbVar75;
  uint16_t *puVar76;
  uint uVar77;
  uint uVar78;
  ushort uVar79;
  uint uVar80;
  int iVar81;
  BLOCK_SIZE BVar82;
  BLOCK_SIZE BVar83;
  byte bVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  ushort *puVar88;
  byte *pbVar89;
  uint8_t *puVar90;
  ulong uVar91;
  uint16_t *puVar92;
  uint uVar93;
  uint8_t **ppuVar94;
  undefined7 in_register_00000089;
  long lVar95;
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  size_t __n_00;
  _func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **pp_Var99;
  size_t __n_01;
  ulong uVar100;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  long lVar105;
  ushort *__src;
  byte *pbVar106;
  bool bVar107;
  byte bVar108;
  bool bVar109;
  undefined4 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  int iVar120;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  int iVar250;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  int iVar251;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  int iVar252;
  int iVar253;
  int iVar264;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  ulong local_ba0;
  uint local_b94;
  uint16_t left_data_2 [160];
  undefined4 auStack_9f8 [7];
  uint16_t local_9da;
  ushort local_9d8;
  uint16_t auStack_9d6 [142];
  ushort uStack_8ba;
  uint16_t left_data [160];
  
  auVar151 = _DAT_004c9e30;
  auVar150 = _DAT_004c9e20;
  auVar286 = _DAT_004c8280;
  auVar267 = _DAT_004c8270;
  auVar146 = _DAT_004c8260;
  uVar91 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_size) * 4);
  uVar104 = *(uint *)((long)tx_size_wide + uVar91);
  __n = (size_t)(int)uVar104;
  uVar78 = *(uint *)((long)tx_size_high + uVar91);
  __n_01 = (size_t)(int)uVar78;
  pMVar10 = *xd->mi;
  uVar101 = (uint)xd->cur_buf->flags >> 3;
  if (use_palette != 0) {
    uVar79 = xd->color_index_map_offset[plane != 0];
    puVar90 = xd->plane[plane != 0].color_index_map;
    if ((uVar101 & 1) == 0) {
      uVar91 = 1;
      if (1 < (int)uVar104) {
        uVar91 = (ulong)uVar104;
      }
      uVar73 = 1;
      if (1 < (int)uVar78) {
        uVar73 = (ulong)uVar78;
      }
      iVar85 = col_off * 4 + row_off * wpx * 4;
      uVar98 = 0;
      do {
        uVar100 = 0;
        do {
          dst[uVar100] = (uint8_t)(pMVar10->palette_mode_info).palette_colors
                                  [(long)(plane << 3) +
                                   (ulong)puVar90[(long)(iVar85 + (int)uVar100) + (ulong)uVar79]];
          uVar100 = uVar100 + 1;
        } while (uVar91 != uVar100);
        uVar98 = uVar98 + 1;
        dst = dst + dst_stride;
        iVar85 = iVar85 + wpx;
      } while (uVar98 != uVar73);
      return;
    }
    lVar105 = (long)dst * 2;
    uVar91 = 1;
    if (1 < (int)uVar104) {
      uVar91 = (ulong)uVar104;
    }
    uVar73 = 1;
    if (1 < (int)uVar78) {
      uVar73 = (ulong)uVar78;
    }
    iVar85 = col_off * 4 + row_off * wpx * 4;
    uVar98 = 0;
    do {
      uVar100 = 0;
      do {
        *(uint16_t *)(lVar105 + uVar100 * 2) =
             (pMVar10->palette_mode_info).palette_colors
             [(long)(plane << 3) + (ulong)puVar90[(long)(iVar85 + (int)uVar100) + (ulong)uVar79]];
        uVar100 = uVar100 + 1;
      } while (uVar91 != uVar100);
      uVar98 = uVar98 + 1;
      lVar105 = lVar105 + (long)dst_stride * 2;
      iVar85 = iVar85 + wpx;
    } while (uVar98 != uVar73);
    return;
  }
  iVar85 = xd->plane[plane].subsampling_y;
  bVar65 = 1;
  cVar63 = '\x01';
  if (row_off == 0) {
    cVar63 = *(char *)((long)xd->block_ref_scale_factors + (ulong)(iVar85 != 0) * 2 + -0x48);
  }
  uVar91 = CONCAT71(in_register_00000089,tx_size) & 0xffffffff;
  iVar68 = xd->plane[plane].subsampling_x;
  if (col_off == 0) {
    bVar65 = *(byte *)((long)xd->block_ref_scale_factors + (ulong)(iVar68 != 0) * 2 + -0x47);
  }
  bVar108 = (byte)iVar68;
  uVar103 = wpx + col_off * -4 + (xd->mb_to_right_edge >> (bVar108 + 3 & 0x1f));
  bVar2 = (byte)iVar85;
  uVar80 = hpx + row_off * -4 + (xd->mb_to_bottom_edge >> (bVar2 + 3 & 0x1f));
  local_b94 = uVar103;
  if ((int)uVar104 < (int)uVar103) {
    local_b94 = uVar104;
  }
  __n_00 = 0;
  if (cVar63 != '\0') {
    __n_00 = (size_t)local_b94;
  }
  uVar77 = uVar80;
  if ((int)uVar78 < (int)uVar80) {
    uVar77 = uVar78;
  }
  uVar73 = (ulong)uVar77;
  if (bVar65 == 0) {
    uVar73 = 0;
  }
  uVar98 = (ulong)mode;
  iVar69 = (int)__n_00;
  iVar120 = (int)uVar73;
  if (7 < (byte)(mode - 1) && filter_intra_mode == '\x05') {
    lVar105 = (long)ref_stride;
    if ((uVar101 & 1) != 0) {
      iVar85 = xd->bd;
      puVar92 = (uint16_t *)((long)dst * 2);
      bVar65 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar98];
      uVar101 = 0x80 << ((char)iVar85 - 8U & 0x1f);
      __src = (ushort *)((long)ref * 2 + lVar105 * -2);
      puVar1 = (ushort *)((long)ref * 2 + -2);
      if (((bVar65 & 4) != 0 || iVar120 != 0) && ((bVar65 & 2) != 0 || iVar69 != 0)) {
        if ((bVar65 & 2) != 0) {
          auVar146 = pshuflw(ZEXT416(uVar101 | 1),ZEXT416(uVar101 | 1),0);
          uVar110 = auVar146._0_4_;
          lVar72 = 0;
          do {
            *(undefined4 *)(left_data + lVar72) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 2) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 4) = uVar110;
            *(undefined4 *)(left_data + lVar72 + 6) = uVar110;
            lVar72 = lVar72 + 8;
          } while (lVar72 != 0xa0);
          if (iVar120 < 1) {
            if (0 < iVar69) {
              uVar79 = *__src;
              lVar105 = __n_01 - 1;
              auVar146._8_4_ = (int)lVar105;
              auVar146._0_8_ = lVar105;
              auVar146._12_4_ = (int)((ulong)lVar105 >> 0x20);
              uVar73 = 0;
              auVar146 = auVar146 ^ _DAT_004c8280;
              do {
                auVar286._8_4_ = (int)uVar73;
                auVar286._0_8_ = uVar73;
                auVar286._12_4_ = (int)(uVar73 >> 0x20);
                auVar267 = (auVar286 | _DAT_004c8270) ^ _DAT_004c8280;
                iVar68 = auVar146._0_4_;
                iVar251 = -(uint)(iVar68 < auVar267._0_4_);
                iVar86 = auVar146._4_4_;
                auVar151._4_4_ = -(uint)(iVar86 < auVar267._4_4_);
                iVar81 = auVar146._8_4_;
                iVar250 = -(uint)(iVar81 < auVar267._8_4_);
                iVar87 = auVar146._12_4_;
                auVar151._12_4_ = -(uint)(iVar87 < auVar267._12_4_);
                auVar238._4_4_ = iVar251;
                auVar238._0_4_ = iVar251;
                auVar238._8_4_ = iVar250;
                auVar238._12_4_ = iVar250;
                auVar112 = pshuflw(in_XMM11,auVar238,0xe8);
                auVar150._4_4_ = -(uint)(auVar267._4_4_ == iVar86);
                auVar150._12_4_ = -(uint)(auVar267._12_4_ == iVar87);
                auVar150._0_4_ = auVar150._4_4_;
                auVar150._8_4_ = auVar150._12_4_;
                auVar287 = pshuflw(in_XMM12,auVar150,0xe8);
                auVar151._0_4_ = auVar151._4_4_;
                auVar151._8_4_ = auVar151._12_4_;
                auVar270 = pshuflw(auVar112,auVar151,0xe8);
                auVar267._8_4_ = 0xffffffff;
                auVar267._0_8_ = 0xffffffffffffffff;
                auVar267._12_4_ = 0xffffffff;
                auVar267 = (auVar270 | auVar287 & auVar112) ^ auVar267;
                auVar267 = packssdw(auVar267,auVar267);
                if ((auVar267 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x10] = uVar79;
                }
                auVar151 = auVar150 & auVar238 | auVar151;
                auVar267 = packssdw(auVar151,auVar151);
                auVar53._8_4_ = 0xffffffff;
                auVar53._0_8_ = 0xffffffffffffffff;
                auVar53._12_4_ = 0xffffffff;
                auVar267 = packssdw(auVar267 ^ auVar53,auVar267 ^ auVar53);
                if ((auVar267._0_4_ >> 0x10 & 1) != 0) {
                  left_data[uVar73 + 0x11] = uVar79;
                }
                auVar267 = (auVar286 | _DAT_004c8260) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar267._0_4_);
                auVar261._4_4_ = -(uint)(iVar86 < auVar267._4_4_);
                iVar250 = -(uint)(iVar81 < auVar267._8_4_);
                auVar261._12_4_ = -(uint)(iVar87 < auVar267._12_4_);
                auVar191._4_4_ = iVar251;
                auVar191._0_4_ = iVar251;
                auVar191._8_4_ = iVar250;
                auVar191._12_4_ = iVar250;
                auVar239._4_4_ = -(uint)(auVar267._4_4_ == iVar86);
                auVar239._12_4_ = -(uint)(auVar267._12_4_ == iVar87);
                auVar239._0_4_ = auVar239._4_4_;
                auVar239._8_4_ = auVar239._12_4_;
                auVar261._0_4_ = auVar261._4_4_;
                auVar261._8_4_ = auVar261._12_4_;
                auVar267 = auVar239 & auVar191 | auVar261;
                auVar267 = packssdw(auVar267,auVar267);
                auVar54._8_4_ = 0xffffffff;
                auVar54._0_8_ = 0xffffffffffffffff;
                auVar54._12_4_ = 0xffffffff;
                auVar267 = packssdw(auVar267 ^ auVar54,auVar267 ^ auVar54);
                if ((auVar267 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x12] = uVar79;
                }
                auVar150 = pshufhw(auVar191,auVar191,0x84);
                auVar270 = pshufhw(auVar239,auVar239,0x84);
                auVar151 = pshufhw(auVar150,auVar261,0x84);
                auVar192._8_4_ = 0xffffffff;
                auVar192._0_8_ = 0xffffffffffffffff;
                auVar192._12_4_ = 0xffffffff;
                auVar192 = (auVar151 | auVar270 & auVar150) ^ auVar192;
                auVar150 = packssdw(auVar192,auVar192);
                if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x13] = uVar79;
                }
                auVar150 = (auVar286 | _DAT_004c9e30) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar150._0_4_);
                auVar194._4_4_ = -(uint)(iVar86 < auVar150._4_4_);
                iVar250 = -(uint)(iVar81 < auVar150._8_4_);
                auVar194._12_4_ = -(uint)(iVar87 < auVar150._12_4_);
                auVar240._4_4_ = iVar251;
                auVar240._0_4_ = iVar251;
                auVar240._8_4_ = iVar250;
                auVar240._12_4_ = iVar250;
                auVar267 = pshuflw(auVar267,auVar240,0xe8);
                auVar193._4_4_ = -(uint)(auVar150._4_4_ == iVar86);
                auVar193._12_4_ = -(uint)(auVar150._12_4_ == iVar87);
                auVar193._0_4_ = auVar193._4_4_;
                auVar193._8_4_ = auVar193._12_4_;
                auVar150 = pshuflw(auVar287 & auVar112,auVar193,0xe8);
                in_XMM12 = auVar150 & auVar267;
                auVar194._0_4_ = auVar194._4_4_;
                auVar194._8_4_ = auVar194._12_4_;
                auVar267 = pshuflw(auVar267,auVar194,0xe8);
                auVar281._8_4_ = 0xffffffff;
                auVar281._0_8_ = 0xffffffffffffffff;
                auVar281._12_4_ = 0xffffffff;
                auVar281 = (auVar267 | in_XMM12) ^ auVar281;
                in_XMM11 = packssdw(auVar281,auVar281);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x14] = uVar79;
                }
                auVar194 = auVar193 & auVar240 | auVar194;
                auVar267 = packssdw(auVar194,auVar194);
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                auVar267 = packssdw(auVar267 ^ auVar55,auVar267 ^ auVar55);
                if ((auVar267 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x15] = uVar79;
                }
                auVar267 = (auVar286 | _DAT_004c9e20) ^ _DAT_004c8280;
                iVar68 = -(uint)(iVar68 < auVar267._0_4_);
                auVar241._4_4_ = -(uint)(iVar86 < auVar267._4_4_);
                iVar81 = -(uint)(iVar81 < auVar267._8_4_);
                auVar241._12_4_ = -(uint)(iVar87 < auVar267._12_4_);
                auVar195._4_4_ = iVar68;
                auVar195._0_4_ = iVar68;
                auVar195._8_4_ = iVar81;
                auVar195._12_4_ = iVar81;
                auVar134._4_4_ = -(uint)(auVar267._4_4_ == iVar86);
                auVar134._12_4_ = -(uint)(auVar267._12_4_ == iVar87);
                auVar134._0_4_ = auVar134._4_4_;
                auVar134._8_4_ = auVar134._12_4_;
                auVar241._0_4_ = auVar241._4_4_;
                auVar241._8_4_ = auVar241._12_4_;
                auVar267 = auVar134 & auVar195 | auVar241;
                auVar267 = packssdw(auVar267,auVar267);
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar267 = packssdw(auVar267 ^ auVar56,auVar267 ^ auVar56);
                if ((auVar267 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x16] = uVar79;
                }
                auVar286 = pshufhw(auVar195,auVar195,0x84);
                auVar267 = pshufhw(auVar134,auVar134,0x84);
                auVar150 = pshufhw(auVar286,auVar241,0x84);
                auVar57._8_4_ = 0xffffffff;
                auVar57._0_8_ = 0xffffffffffffffff;
                auVar57._12_4_ = 0xffffffff;
                auVar267 = packssdw(auVar267 & auVar286,(auVar150 | auVar267 & auVar286) ^ auVar57);
                if ((auVar267 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + 0x17] = uVar79;
                }
                uVar73 = uVar73 + 8;
              } while ((__n_01 + 7 & 0xfffffffffffffff8) != uVar73);
            }
          }
          else {
            uVar100 = 0;
            puVar88 = puVar1;
            do {
              left_data[uVar100 + 0x10] = *puVar88;
              uVar100 = uVar100 + 1;
              puVar88 = puVar88 + lVar105;
            } while (uVar73 != uVar100);
            if (iVar120 < (int)uVar78) {
              uVar66 = left_data[uVar73 + 0xf];
              lVar105 = (long)(int)(uVar78 - iVar120) + -1;
              auVar111._8_4_ = (int)lVar105;
              auVar111._0_8_ = lVar105;
              auVar111._12_4_ = (int)((ulong)lVar105 >> 0x20);
              uVar100 = 0;
              auVar111 = auVar111 ^ _DAT_004c8280;
              do {
                auVar121._8_4_ = (int)uVar100;
                auVar121._0_8_ = uVar100;
                auVar121._12_4_ = (int)(uVar100 >> 0x20);
                auVar146 = (auVar121 | _DAT_004c8270) ^ _DAT_004c8280;
                iVar68 = auVar111._0_4_;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                iVar86 = auVar111._4_4_;
                auVar140._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = auVar111._8_4_;
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                iVar87 = auVar111._12_4_;
                auVar140._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar210._4_4_ = iVar251;
                auVar210._0_4_ = iVar251;
                auVar210._8_4_ = iVar250;
                auVar210._12_4_ = iVar250;
                auVar267 = pshuflw(in_XMM11,auVar210,0xe8);
                auVar139._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar139._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar139._0_4_ = auVar139._4_4_;
                auVar139._8_4_ = auVar139._12_4_;
                auVar286 = pshuflw(in_XMM12,auVar139,0xe8);
                auVar140._0_4_ = auVar140._4_4_;
                auVar140._8_4_ = auVar140._12_4_;
                auVar146 = pshuflw(auVar267,auVar140,0xe8);
                auVar265._8_4_ = 0xffffffff;
                auVar265._0_8_ = 0xffffffffffffffff;
                auVar265._12_4_ = 0xffffffff;
                auVar265 = (auVar146 | auVar286 & auVar267) ^ auVar265;
                auVar146 = packssdw(auVar265,auVar265);
                if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x10] = uVar66;
                }
                auVar140 = auVar139 & auVar210 | auVar140;
                auVar146 = packssdw(auVar140,auVar140);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar38,auVar146 ^ auVar38);
                if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
                  left_data[uVar73 + uVar100 + 0x11] = uVar66;
                }
                auVar146 = (auVar121 | _DAT_004c8260) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                auVar254._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                auVar254._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar141._4_4_ = iVar251;
                auVar141._0_4_ = iVar251;
                auVar141._8_4_ = iVar250;
                auVar141._12_4_ = iVar250;
                auVar211._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar211._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar211._0_4_ = auVar211._4_4_;
                auVar211._8_4_ = auVar211._12_4_;
                auVar254._0_4_ = auVar254._4_4_;
                auVar254._8_4_ = auVar254._12_4_;
                auVar146 = auVar211 & auVar141 | auVar254;
                auVar146 = packssdw(auVar146,auVar146);
                auVar39._8_4_ = 0xffffffff;
                auVar39._0_8_ = 0xffffffffffffffff;
                auVar39._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar39,auVar146 ^ auVar39);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x12] = uVar66;
                }
                auVar150 = pshufhw(auVar141,auVar141,0x84);
                auVar112 = pshufhw(auVar211,auVar211,0x84);
                auVar151 = pshufhw(auVar150,auVar254,0x84);
                auVar142._8_4_ = 0xffffffff;
                auVar142._0_8_ = 0xffffffffffffffff;
                auVar142._12_4_ = 0xffffffff;
                auVar142 = (auVar151 | auVar112 & auVar150) ^ auVar142;
                auVar150 = packssdw(auVar142,auVar142);
                if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x13] = uVar66;
                }
                auVar150 = (auVar121 | _DAT_004c9e30) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar150._0_4_);
                auVar144._4_4_ = -(uint)(iVar86 < auVar150._4_4_);
                iVar250 = -(uint)(iVar81 < auVar150._8_4_);
                auVar144._12_4_ = -(uint)(iVar87 < auVar150._12_4_);
                auVar212._4_4_ = iVar251;
                auVar212._0_4_ = iVar251;
                auVar212._8_4_ = iVar250;
                auVar212._12_4_ = iVar250;
                auVar146 = pshuflw(auVar146,auVar212,0xe8);
                auVar143._4_4_ = -(uint)(auVar150._4_4_ == iVar86);
                auVar143._12_4_ = -(uint)(auVar150._12_4_ == iVar87);
                auVar143._0_4_ = auVar143._4_4_;
                auVar143._8_4_ = auVar143._12_4_;
                auVar267 = pshuflw(auVar286 & auVar267,auVar143,0xe8);
                in_XMM12 = auVar267 & auVar146;
                auVar144._0_4_ = auVar144._4_4_;
                auVar144._8_4_ = auVar144._12_4_;
                auVar146 = pshuflw(auVar146,auVar144,0xe8);
                auVar266._8_4_ = 0xffffffff;
                auVar266._0_8_ = 0xffffffffffffffff;
                auVar266._12_4_ = 0xffffffff;
                auVar266 = (auVar146 | in_XMM12) ^ auVar266;
                in_XMM11 = packssdw(auVar266,auVar266);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x14] = uVar66;
                }
                auVar144 = auVar143 & auVar212 | auVar144;
                auVar146 = packssdw(auVar144,auVar144);
                auVar40._8_4_ = 0xffffffff;
                auVar40._0_8_ = 0xffffffffffffffff;
                auVar40._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar40,auVar146 ^ auVar40);
                if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x15] = uVar66;
                }
                auVar146 = (auVar121 | _DAT_004c9e20) ^ _DAT_004c8280;
                iVar68 = -(uint)(iVar68 < auVar146._0_4_);
                auVar213._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = -(uint)(iVar81 < auVar146._8_4_);
                auVar213._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar145._4_4_ = iVar68;
                auVar145._0_4_ = iVar68;
                auVar145._8_4_ = iVar81;
                auVar145._12_4_ = iVar81;
                auVar122._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar122._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar122._0_4_ = auVar122._4_4_;
                auVar122._8_4_ = auVar122._12_4_;
                auVar213._0_4_ = auVar213._4_4_;
                auVar213._8_4_ = auVar213._12_4_;
                auVar146 = auVar122 & auVar145 | auVar213;
                auVar146 = packssdw(auVar146,auVar146);
                auVar41._8_4_ = 0xffffffff;
                auVar41._0_8_ = 0xffffffffffffffff;
                auVar41._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar41,auVar146 ^ auVar41);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x16] = uVar66;
                }
                auVar267 = pshufhw(auVar145,auVar145,0x84);
                auVar146 = pshufhw(auVar122,auVar122,0x84);
                auVar286 = pshufhw(auVar267,auVar213,0x84);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar42);
                if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data[uVar73 + uVar100 + 0x17] = uVar66;
                }
                uVar100 = uVar100 + 8;
              } while (((long)(int)(uVar78 - iVar120) + 7U & 0xfffffffffffffff8) != uVar100);
            }
          }
        }
        if ((bVar65 & 4) != 0) {
          auVar146 = pshuflw(ZEXT416(uVar101 - 1),ZEXT416(uVar101 - 1),0);
          uVar110 = auVar146._0_4_;
          lVar105 = 0;
          do {
            *(undefined4 *)(left_data_2 + lVar105) = uVar110;
            *(undefined4 *)(left_data_2 + lVar105 + 2) = uVar110;
            *(undefined4 *)(left_data_2 + lVar105 + 4) = uVar110;
            *(undefined4 *)(left_data_2 + lVar105 + 6) = uVar110;
            lVar105 = lVar105 + 8;
          } while (lVar105 != 0xa0);
          if (iVar69 < 1) {
            if (0 < iVar120) {
              uVar79 = *puVar1;
              lVar105 = __n - 1;
              auVar119._8_4_ = (int)lVar105;
              auVar119._0_8_ = lVar105;
              auVar119._12_4_ = (int)((ulong)lVar105 >> 0x20);
              uVar73 = 0;
              auVar119 = auVar119 ^ _DAT_004c8280;
              do {
                auVar137._8_4_ = (int)uVar73;
                auVar137._0_8_ = uVar73;
                auVar137._12_4_ = (int)(uVar73 >> 0x20);
                auVar146 = (auVar137 | _DAT_004c8270) ^ _DAT_004c8280;
                iVar68 = auVar119._0_4_;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                iVar86 = auVar119._4_4_;
                auVar204._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = auVar119._8_4_;
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                iVar87 = auVar119._12_4_;
                auVar204._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar246._4_4_ = iVar251;
                auVar246._0_4_ = iVar251;
                auVar246._8_4_ = iVar250;
                auVar246._12_4_ = iVar250;
                auVar267 = pshuflw(in_XMM11,auVar246,0xe8);
                auVar203._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar203._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar203._0_4_ = auVar203._4_4_;
                auVar203._8_4_ = auVar203._12_4_;
                auVar286 = pshuflw(in_XMM12,auVar203,0xe8);
                auVar204._0_4_ = auVar204._4_4_;
                auVar204._8_4_ = auVar204._12_4_;
                auVar146 = pshuflw(auVar267,auVar204,0xe8);
                auVar284._8_4_ = 0xffffffff;
                auVar284._0_8_ = 0xffffffffffffffff;
                auVar284._12_4_ = 0xffffffff;
                auVar284 = (auVar146 | auVar286 & auVar267) ^ auVar284;
                auVar146 = packssdw(auVar284,auVar284);
                if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x10] = uVar79;
                }
                auVar204 = auVar203 & auVar246 | auVar204;
                auVar146 = packssdw(auVar204,auVar204);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar48,auVar146 ^ auVar48);
                if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
                  left_data_2[uVar73 + 0x11] = uVar79;
                }
                auVar146 = (auVar137 | _DAT_004c8260) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                auVar263._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                auVar263._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar205._4_4_ = iVar251;
                auVar205._0_4_ = iVar251;
                auVar205._8_4_ = iVar250;
                auVar205._12_4_ = iVar250;
                auVar247._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar247._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar247._0_4_ = auVar247._4_4_;
                auVar247._8_4_ = auVar247._12_4_;
                auVar263._0_4_ = auVar263._4_4_;
                auVar263._8_4_ = auVar263._12_4_;
                auVar146 = auVar247 & auVar205 | auVar263;
                auVar146 = packssdw(auVar146,auVar146);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar49,auVar146 ^ auVar49);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x12] = uVar79;
                }
                auVar150 = pshufhw(auVar205,auVar205,0x84);
                auVar112 = pshufhw(auVar247,auVar247,0x84);
                auVar151 = pshufhw(auVar150,auVar263,0x84);
                auVar206._8_4_ = 0xffffffff;
                auVar206._0_8_ = 0xffffffffffffffff;
                auVar206._12_4_ = 0xffffffff;
                auVar206 = (auVar151 | auVar112 & auVar150) ^ auVar206;
                auVar150 = packssdw(auVar206,auVar206);
                if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x13] = uVar79;
                }
                auVar150 = (auVar137 | _DAT_004c9e30) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar150._0_4_);
                auVar208._4_4_ = -(uint)(iVar86 < auVar150._4_4_);
                iVar250 = -(uint)(iVar81 < auVar150._8_4_);
                auVar208._12_4_ = -(uint)(iVar87 < auVar150._12_4_);
                auVar248._4_4_ = iVar251;
                auVar248._0_4_ = iVar251;
                auVar248._8_4_ = iVar250;
                auVar248._12_4_ = iVar250;
                auVar146 = pshuflw(auVar146,auVar248,0xe8);
                auVar207._4_4_ = -(uint)(auVar150._4_4_ == iVar86);
                auVar207._12_4_ = -(uint)(auVar150._12_4_ == iVar87);
                auVar207._0_4_ = auVar207._4_4_;
                auVar207._8_4_ = auVar207._12_4_;
                auVar267 = pshuflw(auVar286 & auVar267,auVar207,0xe8);
                in_XMM12 = auVar267 & auVar146;
                auVar208._0_4_ = auVar208._4_4_;
                auVar208._8_4_ = auVar208._12_4_;
                auVar146 = pshuflw(auVar146,auVar208,0xe8);
                auVar285._8_4_ = 0xffffffff;
                auVar285._0_8_ = 0xffffffffffffffff;
                auVar285._12_4_ = 0xffffffff;
                auVar285 = (auVar146 | in_XMM12) ^ auVar285;
                in_XMM11 = packssdw(auVar285,auVar285);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x14] = uVar79;
                }
                auVar208 = auVar207 & auVar248 | auVar208;
                auVar146 = packssdw(auVar208,auVar208);
                auVar50._8_4_ = 0xffffffff;
                auVar50._0_8_ = 0xffffffffffffffff;
                auVar50._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar50,auVar146 ^ auVar50);
                if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x15] = uVar79;
                }
                auVar146 = (auVar137 | _DAT_004c9e20) ^ _DAT_004c8280;
                iVar68 = -(uint)(iVar68 < auVar146._0_4_);
                auVar249._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = -(uint)(iVar81 < auVar146._8_4_);
                auVar249._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar209._4_4_ = iVar68;
                auVar209._0_4_ = iVar68;
                auVar209._8_4_ = iVar81;
                auVar209._12_4_ = iVar81;
                auVar138._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar138._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar138._0_4_ = auVar138._4_4_;
                auVar138._8_4_ = auVar138._12_4_;
                auVar249._0_4_ = auVar249._4_4_;
                auVar249._8_4_ = auVar249._12_4_;
                auVar146 = auVar138 & auVar209 | auVar249;
                auVar146 = packssdw(auVar146,auVar146);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar51,auVar146 ^ auVar51);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x16] = uVar79;
                }
                auVar267 = pshufhw(auVar209,auVar209,0x84);
                auVar146 = pshufhw(auVar138,auVar138,0x84);
                auVar286 = pshufhw(auVar267,auVar249,0x84);
                auVar52._8_4_ = 0xffffffff;
                auVar52._0_8_ = 0xffffffffffffffff;
                auVar52._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar52);
                if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[uVar73 + 0x17] = uVar79;
                }
                uVar73 = uVar73 + 8;
              } while ((__n + 7 & 0xfffffffffffffff8) != uVar73);
            }
          }
          else {
            memcpy(left_data_2 + 0x10,__src,__n_00 * 2);
            if (iVar69 < (int)uVar104) {
              uVar66 = left_data_2[__n_00 + 0xf];
              lVar105 = (long)(int)(uVar104 - iVar69) + -1;
              auVar118._8_4_ = (int)lVar105;
              auVar118._0_8_ = lVar105;
              auVar118._12_4_ = (int)((ulong)lVar105 >> 0x20);
              uVar73 = 0;
              auVar118 = auVar118 ^ _DAT_004c8280;
              do {
                auVar135._8_4_ = (int)uVar73;
                auVar135._0_8_ = uVar73;
                auVar135._12_4_ = (int)(uVar73 >> 0x20);
                auVar146 = (auVar135 | _DAT_004c8270) ^ _DAT_004c8280;
                iVar68 = auVar118._0_4_;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                iVar86 = auVar118._4_4_;
                auVar197._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = auVar118._8_4_;
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                iVar87 = auVar118._12_4_;
                auVar197._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar242._4_4_ = iVar251;
                auVar242._0_4_ = iVar251;
                auVar242._8_4_ = iVar250;
                auVar242._12_4_ = iVar250;
                auVar267 = pshuflw(in_XMM11,auVar242,0xe8);
                auVar196._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar196._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar196._0_4_ = auVar196._4_4_;
                auVar196._8_4_ = auVar196._12_4_;
                auVar286 = pshuflw(in_XMM12,auVar196,0xe8);
                auVar197._0_4_ = auVar197._4_4_;
                auVar197._8_4_ = auVar197._12_4_;
                auVar146 = pshuflw(auVar267,auVar197,0xe8);
                auVar282._8_4_ = 0xffffffff;
                auVar282._0_8_ = 0xffffffffffffffff;
                auVar282._12_4_ = 0xffffffff;
                auVar282 = (auVar146 | auVar286 & auVar267) ^ auVar282;
                auVar146 = packssdw(auVar282,auVar282);
                if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x10] = uVar66;
                }
                auVar197 = auVar196 & auVar242 | auVar197;
                auVar146 = packssdw(auVar197,auVar197);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar43,auVar146 ^ auVar43);
                if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
                  left_data_2[__n_00 + uVar73 + 0x11] = uVar66;
                }
                auVar146 = (auVar135 | _DAT_004c8260) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar146._0_4_);
                auVar262._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar250 = -(uint)(iVar81 < auVar146._8_4_);
                auVar262._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar198._4_4_ = iVar251;
                auVar198._0_4_ = iVar251;
                auVar198._8_4_ = iVar250;
                auVar198._12_4_ = iVar250;
                auVar243._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar243._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar243._0_4_ = auVar243._4_4_;
                auVar243._8_4_ = auVar243._12_4_;
                auVar262._0_4_ = auVar262._4_4_;
                auVar262._8_4_ = auVar262._12_4_;
                auVar146 = auVar243 & auVar198 | auVar262;
                auVar146 = packssdw(auVar146,auVar146);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar44,auVar146 ^ auVar44);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x12] = uVar66;
                }
                auVar150 = pshufhw(auVar198,auVar198,0x84);
                auVar112 = pshufhw(auVar243,auVar243,0x84);
                auVar151 = pshufhw(auVar150,auVar262,0x84);
                auVar199._8_4_ = 0xffffffff;
                auVar199._0_8_ = 0xffffffffffffffff;
                auVar199._12_4_ = 0xffffffff;
                auVar199 = (auVar151 | auVar112 & auVar150) ^ auVar199;
                auVar150 = packssdw(auVar199,auVar199);
                if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x13] = uVar66;
                }
                auVar150 = (auVar135 | _DAT_004c9e30) ^ _DAT_004c8280;
                iVar251 = -(uint)(iVar68 < auVar150._0_4_);
                auVar201._4_4_ = -(uint)(iVar86 < auVar150._4_4_);
                iVar250 = -(uint)(iVar81 < auVar150._8_4_);
                auVar201._12_4_ = -(uint)(iVar87 < auVar150._12_4_);
                auVar244._4_4_ = iVar251;
                auVar244._0_4_ = iVar251;
                auVar244._8_4_ = iVar250;
                auVar244._12_4_ = iVar250;
                auVar146 = pshuflw(auVar146,auVar244,0xe8);
                auVar200._4_4_ = -(uint)(auVar150._4_4_ == iVar86);
                auVar200._12_4_ = -(uint)(auVar150._12_4_ == iVar87);
                auVar200._0_4_ = auVar200._4_4_;
                auVar200._8_4_ = auVar200._12_4_;
                auVar267 = pshuflw(auVar286 & auVar267,auVar200,0xe8);
                in_XMM12 = auVar267 & auVar146;
                auVar201._0_4_ = auVar201._4_4_;
                auVar201._8_4_ = auVar201._12_4_;
                auVar146 = pshuflw(auVar146,auVar201,0xe8);
                auVar283._8_4_ = 0xffffffff;
                auVar283._0_8_ = 0xffffffffffffffff;
                auVar283._12_4_ = 0xffffffff;
                auVar283 = (auVar146 | in_XMM12) ^ auVar283;
                in_XMM11 = packssdw(auVar283,auVar283);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x14] = uVar66;
                }
                auVar201 = auVar200 & auVar244 | auVar201;
                auVar146 = packssdw(auVar201,auVar201);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar45,auVar146 ^ auVar45);
                if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x15] = uVar66;
                }
                auVar146 = (auVar135 | _DAT_004c9e20) ^ _DAT_004c8280;
                iVar68 = -(uint)(iVar68 < auVar146._0_4_);
                auVar245._4_4_ = -(uint)(iVar86 < auVar146._4_4_);
                iVar81 = -(uint)(iVar81 < auVar146._8_4_);
                auVar245._12_4_ = -(uint)(iVar87 < auVar146._12_4_);
                auVar202._4_4_ = iVar68;
                auVar202._0_4_ = iVar68;
                auVar202._8_4_ = iVar81;
                auVar202._12_4_ = iVar81;
                auVar136._4_4_ = -(uint)(auVar146._4_4_ == iVar86);
                auVar136._12_4_ = -(uint)(auVar146._12_4_ == iVar87);
                auVar136._0_4_ = auVar136._4_4_;
                auVar136._8_4_ = auVar136._12_4_;
                auVar245._0_4_ = auVar245._4_4_;
                auVar245._8_4_ = auVar245._12_4_;
                auVar146 = auVar136 & auVar202 | auVar245;
                auVar146 = packssdw(auVar146,auVar146);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 ^ auVar46,auVar146 ^ auVar46);
                if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x16] = uVar66;
                }
                auVar267 = pshufhw(auVar202,auVar202,0x84);
                auVar146 = pshufhw(auVar136,auVar136,0x84);
                auVar286 = pshufhw(auVar267,auVar245,0x84);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar47);
                if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  left_data_2[__n_00 + uVar73 + 0x17] = uVar66;
                }
                uVar73 = uVar73 + 8;
              } while (((long)(int)(uVar104 - iVar69) + 7U & 0xfffffffffffffff8) != uVar73);
            }
          }
        }
        if ((bVar65 & 0x10) != 0) {
          if ((iVar69 < 1) || (iVar120 < 1)) {
            if (iVar69 < 1) {
              if (0 < iVar120) {
                uVar101 = (uint)*puVar1;
              }
            }
            else {
              uVar101 = (uint)*__src;
            }
          }
          else {
            uVar101 = (uint)__src[-1];
          }
          left_data_2[0xf] = (uint16_t)uVar101;
          left_data[0xf] = left_data_2[0xf];
        }
        if (mode == '\0') {
          pap_Var62 = dc_pred_high[0 < iVar120] + (0 < iVar69);
        }
        else {
          pap_Var62 = pred_high + uVar98;
        }
        (*(*pap_Var62)[uVar91])(puVar92,(long)dst_stride,left_data_2 + 0x10,left_data + 0x10,iVar85)
        ;
        return;
      }
      if ((bVar65 & 2) == 0) {
        if (iVar120 < 1) {
          uVar79 = (ushort)uVar101 - 1;
        }
        else {
          uVar79 = *puVar1;
        }
      }
      else if (iVar69 < 1) {
        uVar79 = (ushort)uVar101 | 1;
      }
      else {
        uVar79 = *__src;
      }
      uVar104 = 1;
      if (1 < (int)uVar78) {
        uVar104 = uVar78;
      }
      lVar105 = __n - 1;
      auVar112._8_4_ = (int)lVar105;
      auVar112._0_8_ = lVar105;
      auVar112._12_4_ = (int)((ulong)lVar105 >> 0x20);
      uVar78 = 0;
      auVar112 = auVar112 ^ _DAT_004c8280;
      do {
        uVar91 = 0;
        do {
          auVar287._8_4_ = (int)uVar91;
          auVar287._0_8_ = uVar91;
          auVar287._12_4_ = (int)(uVar91 >> 0x20);
          auVar270 = (auVar287 | auVar267) ^ auVar286;
          iVar85 = auVar112._0_4_;
          iVar86 = -(uint)(iVar85 < auVar270._0_4_);
          iVar68 = auVar112._4_4_;
          auVar160._4_4_ = -(uint)(iVar68 < auVar270._4_4_);
          iVar69 = auVar112._8_4_;
          iVar81 = -(uint)(iVar69 < auVar270._8_4_);
          iVar120 = auVar112._12_4_;
          auVar160._12_4_ = -(uint)(iVar120 < auVar270._12_4_);
          auVar220._4_4_ = iVar86;
          auVar220._0_4_ = iVar86;
          auVar220._8_4_ = iVar81;
          auVar220._12_4_ = iVar81;
          auVar279 = pshuflw(in_XMM11,auVar220,0xe8);
          auVar159._4_4_ = -(uint)(auVar270._4_4_ == iVar68);
          auVar159._12_4_ = -(uint)(auVar270._12_4_ == iVar120);
          auVar159._0_4_ = auVar159._4_4_;
          auVar159._8_4_ = auVar159._12_4_;
          auVar288 = pshuflw(in_XMM12,auVar159,0xe8);
          auVar160._0_4_ = auVar160._4_4_;
          auVar160._8_4_ = auVar160._12_4_;
          auVar280 = pshuflw(auVar279,auVar160,0xe8);
          auVar270._8_4_ = 0xffffffff;
          auVar270._0_8_ = 0xffffffffffffffff;
          auVar270._12_4_ = 0xffffffff;
          auVar270 = (auVar280 | auVar288 & auVar279) ^ auVar270;
          auVar270 = packssdw(auVar270,auVar270);
          if ((auVar270 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar92[uVar91] = uVar79;
          }
          auVar160 = auVar159 & auVar220 | auVar160;
          auVar270 = packssdw(auVar160,auVar160);
          auVar280._8_4_ = 0xffffffff;
          auVar280._0_8_ = 0xffffffffffffffff;
          auVar280._12_4_ = 0xffffffff;
          auVar270 = packssdw(auVar270 ^ auVar280,auVar270 ^ auVar280);
          if ((auVar270._0_4_ >> 0x10 & 1) != 0) {
            puVar92[uVar91 + 1] = uVar79;
          }
          auVar270 = (auVar287 | auVar146) ^ auVar286;
          iVar86 = -(uint)(iVar85 < auVar270._0_4_);
          auVar260._4_4_ = -(uint)(iVar68 < auVar270._4_4_);
          iVar81 = -(uint)(iVar69 < auVar270._8_4_);
          auVar260._12_4_ = -(uint)(iVar120 < auVar270._12_4_);
          auVar186._4_4_ = iVar86;
          auVar186._0_4_ = iVar86;
          auVar186._8_4_ = iVar81;
          auVar186._12_4_ = iVar81;
          auVar235._4_4_ = -(uint)(auVar270._4_4_ == iVar68);
          auVar235._12_4_ = -(uint)(auVar270._12_4_ == iVar120);
          auVar235._0_4_ = auVar235._4_4_;
          auVar235._8_4_ = auVar235._12_4_;
          auVar260._0_4_ = auVar260._4_4_;
          auVar260._8_4_ = auVar260._12_4_;
          auVar270 = auVar235 & auVar186 | auVar260;
          auVar270 = packssdw(auVar270,auVar270);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar270 = packssdw(auVar270 ^ auVar58,auVar270 ^ auVar58);
          if ((auVar270 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 2] = uVar79;
          }
          auVar159 = pshufhw(auVar186,auVar186,0x84);
          auVar220 = pshufhw(auVar235,auVar235,0x84);
          auVar160 = pshufhw(auVar159,auVar260,0x84);
          auVar187._8_4_ = 0xffffffff;
          auVar187._0_8_ = 0xffffffffffffffff;
          auVar187._12_4_ = 0xffffffff;
          auVar187 = (auVar160 | auVar220 & auVar159) ^ auVar187;
          auVar159 = packssdw(auVar187,auVar187);
          if ((auVar159 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 3] = uVar79;
          }
          auVar159 = (auVar287 | auVar151) ^ auVar286;
          iVar86 = -(uint)(iVar85 < auVar159._0_4_);
          auVar189._4_4_ = -(uint)(iVar68 < auVar159._4_4_);
          iVar81 = -(uint)(iVar69 < auVar159._8_4_);
          auVar189._12_4_ = -(uint)(iVar120 < auVar159._12_4_);
          auVar236._4_4_ = iVar86;
          auVar236._0_4_ = iVar86;
          auVar236._8_4_ = iVar81;
          auVar236._12_4_ = iVar81;
          auVar270 = pshuflw(auVar270,auVar236,0xe8);
          auVar188._4_4_ = -(uint)(auVar159._4_4_ == iVar68);
          auVar188._12_4_ = -(uint)(auVar159._12_4_ == iVar120);
          auVar188._0_4_ = auVar188._4_4_;
          auVar188._8_4_ = auVar188._12_4_;
          auVar159 = pshuflw(auVar288 & auVar279,auVar188,0xe8);
          in_XMM12 = auVar159 & auVar270;
          auVar189._0_4_ = auVar189._4_4_;
          auVar189._8_4_ = auVar189._12_4_;
          auVar270 = pshuflw(auVar270,auVar189,0xe8);
          auVar279._8_4_ = 0xffffffff;
          auVar279._0_8_ = 0xffffffffffffffff;
          auVar279._12_4_ = 0xffffffff;
          auVar279 = (auVar270 | in_XMM12) ^ auVar279;
          in_XMM11 = packssdw(auVar279,auVar279);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 4] = uVar79;
          }
          auVar189 = auVar188 & auVar236 | auVar189;
          auVar270 = packssdw(auVar189,auVar189);
          auVar288._8_4_ = 0xffffffff;
          auVar288._0_8_ = 0xffffffffffffffff;
          auVar288._12_4_ = 0xffffffff;
          auVar270 = packssdw(auVar270 ^ auVar288,auVar270 ^ auVar288);
          if ((auVar270 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 5] = uVar79;
          }
          auVar270 = (auVar287 | auVar150) ^ auVar286;
          iVar85 = -(uint)(iVar85 < auVar270._0_4_);
          auVar237._4_4_ = -(uint)(iVar68 < auVar270._4_4_);
          iVar69 = -(uint)(iVar69 < auVar270._8_4_);
          auVar237._12_4_ = -(uint)(iVar120 < auVar270._12_4_);
          auVar190._4_4_ = iVar85;
          auVar190._0_4_ = iVar85;
          auVar190._8_4_ = iVar69;
          auVar190._12_4_ = iVar69;
          auVar133._4_4_ = -(uint)(auVar270._4_4_ == iVar68);
          auVar133._12_4_ = -(uint)(auVar270._12_4_ == iVar120);
          auVar133._0_4_ = auVar133._4_4_;
          auVar133._8_4_ = auVar133._12_4_;
          auVar237._0_4_ = auVar237._4_4_;
          auVar237._8_4_ = auVar237._12_4_;
          auVar270 = auVar133 & auVar190 | auVar237;
          auVar270 = packssdw(auVar270,auVar270);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar270 = packssdw(auVar270 ^ auVar59,auVar270 ^ auVar59);
          if ((auVar270 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 6] = uVar79;
          }
          auVar287 = pshufhw(auVar190,auVar190,0x84);
          auVar270 = pshufhw(auVar133,auVar133,0x84);
          auVar159 = pshufhw(auVar287,auVar237,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar270 = packssdw(auVar270 & auVar287,(auVar159 | auVar270 & auVar287) ^ auVar60);
          if ((auVar270 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar92[uVar91 + 7] = uVar79;
          }
          uVar91 = uVar91 + 8;
        } while ((__n + 7 & 0xfffffffffffffff8) != uVar91);
        uVar78 = uVar78 + 1;
        puVar92 = puVar92 + dst_stride;
      } while (uVar78 != uVar104);
      return;
    }
    pbVar106 = ref + -lVar105;
    pbVar75 = ref + -1;
    bVar65 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar98];
    if (((bVar65 & 4) == 0 && iVar120 == 0) || ((bVar65 & 2) == 0 && iVar69 == 0)) {
      if ((bVar65 & 2) == 0) {
        pbVar106 = pbVar75;
        if (iVar120 < 1) {
          bVar65 = 0x7f;
          goto LAB_003a1273;
        }
      }
      else if (iVar69 < 1) {
        bVar65 = 0x81;
        goto LAB_003a1273;
      }
      bVar65 = *pbVar106;
LAB_003a1273:
      uVar104 = 1;
      if (1 < (int)uVar78) {
        uVar104 = uVar78;
      }
      do {
        memset(dst,(uint)bVar65,__n);
        dst = dst + dst_stride;
        uVar104 = uVar104 - 1;
      } while (uVar104 != 0);
      return;
    }
    if ((bVar65 & 2) != 0) {
      memset(left_data,0x81,0xa0);
      if (iVar120 < 1) {
        if (0 < iVar69) {
          bVar108 = *pbVar106;
          puVar92 = left_data + 8;
          goto LAB_003a1599;
        }
      }
      else {
        uVar100 = 0;
        pbVar89 = pbVar75;
        do {
          *(byte *)((long)left_data + uVar100 + 0x10) = *pbVar89;
          uVar100 = uVar100 + 1;
          pbVar89 = pbVar89 + lVar105;
        } while (uVar73 != uVar100);
        if (iVar120 < (int)uVar78) {
          puVar92 = (uint16_t *)((long)left_data + uVar73 + 0x10);
          __n_01 = (size_t)(int)(uVar78 - iVar120);
          bVar108 = *(byte *)((long)left_data + uVar73 + 0xf);
LAB_003a1599:
          memset(puVar92,(uint)bVar108,__n_01);
        }
      }
    }
    puVar92 = left_data_2 + 8;
    if ((bVar65 & 4) != 0) {
      memset(left_data_2,0x7f,0xa0);
      if (iVar69 < 1) {
        if (0 < iVar120) {
          bVar108 = *pbVar75;
          puVar70 = puVar92;
          goto LAB_003a1c3f;
        }
      }
      else {
        memcpy(puVar92,pbVar106,__n_00);
        if (iVar69 < (int)uVar104) {
          __n = (size_t)(int)(uVar104 - iVar69);
          bVar108 = *(byte *)((long)left_data_2 + __n_00 + 0xf);
          puVar70 = (uint16_t *)((long)puVar92 + __n_00);
LAB_003a1c3f:
          memset(puVar70,(uint)bVar108,__n);
        }
      }
    }
    if ((bVar65 & 0x10) != 0) {
      if ((iVar69 < 1) || (iVar120 < 1)) {
        if ((iVar69 < 1) &&
           (left_data_2[7]._1_1_ = 0x80, pbVar106 = pbVar75,
           left_data[7]._1_1_ = left_data_2[7]._1_1_, iVar120 < 1)) goto LAB_003a1c90;
      }
      else {
        pbVar106 = pbVar106 + -1;
      }
      left_data_2[7]._1_1_ = *pbVar106;
      left_data[7]._1_1_ = left_data_2[7]._1_1_;
    }
LAB_003a1c90:
    if (mode == '\0') {
      pap_Var61 = dc_pred[0 < iVar120] + (0 < iVar69);
    }
    else {
      pap_Var61 = pred + uVar98;
    }
    (*(*pap_Var61)[uVar91])(dst,(long)dst_stride,(uint8_t *)puVar92,(uint8_t *)(left_data + 8));
    return;
  }
  uVar80 = uVar80 - uVar78;
  uVar77 = -xd->mb_to_top_edge >> 5;
  uVar96 = tx_size_wide_unit[uVar91] + col_off;
  if ((int)uVar80 < 1) {
    bVar107 = false;
  }
  else {
    bVar107 = (int)((tx_size_high_unit[uVar91] + row_off << (bVar2 & 0x1f)) + uVar77) <
              (xd->tile).mi_row_end;
  }
  BVar82 = pMVar10->bsize;
  if (iVar68 != 0 || iVar85 != 0) {
    if (BVar82 < BLOCK_8X4) {
      if (BVar82 != BLOCK_4X4) {
        if (BVar82 == BLOCK_4X8) {
          BVar82 = (iVar68 == 1) * '\x02' + BLOCK_4X8;
        }
        goto LAB_0039f66a;
      }
      BVar82 = iVar85 == 1;
      BVar83 = (iVar68 == 1 && (bool)BVar82) | BLOCK_8X4;
    }
    else if (BVar82 == BLOCK_8X4) {
      BVar82 = iVar85 == 1 | BLOCK_8X4;
      BVar83 = (iVar68 == 1 && iVar85 == 1) | BLOCK_8X4;
    }
    else {
      if (BVar82 != BLOCK_4X16) {
        if ((BVar82 == BLOCK_16X4) && (BVar82 = BLOCK_16X8, iVar85 != 1)) {
          BVar82 = BLOCK_16X4;
        }
        goto LAB_0039f66a;
      }
      BVar83 = BLOCK_8X16;
      BVar82 = BLOCK_4X16;
    }
    if (iVar68 == 1) {
      BVar82 = BVar83;
    }
  }
LAB_0039f66a:
  bVar64 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[uVar98];
  bVar84 = bVar64 & 0x20;
  if (filter_intra_mode != '\x05') {
    bVar84 = 0;
  }
  local_ba0 = 0;
  bVar71 = bVar64 & 8;
  if (filter_intra_mode != '\x05') {
    bVar71 = 0;
  }
  if ((byte)(mode - 1) < 8) {
    uVar93 = (uint)""[uVar98] + angle_delta;
    local_ba0 = (ulong)uVar93;
    bVar71 = (int)uVar93 < 0x5a;
    bVar84 = 0xb4 < (int)uVar93;
  }
  uVar102 = -xd->mb_to_left_edge >> 5;
  uVar93 = 0xffffffff;
  uVar67 = 0xffffffff;
  if (bVar71 != 0) {
    if (cVar63 == '\x01' && (int)((uVar96 << (bVar108 & 0x1f)) + uVar102) < (xd->tile).mi_col_end) {
      uVar67 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [BVar82] >> (bVar108 & 0x1f));
      iVar85 = uVar67 + (uVar67 == 0);
      if (row_off < 1) {
        uVar67 = 1;
        if (iVar85 <= (int)uVar96) {
          uVar96 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [(uint)sb_size] - 1;
          iVar68 = (int)(uVar96 & uVar77) >> (""[BVar82] & 0x1f);
          bVar71 = ""[BVar82];
          iVar85 = (int)(uVar96 & uVar102) >> (bVar71 & 0x1f);
          if ((iVar68 != 0) &&
             (uVar67 = 0,
             iVar85 + 1 << (bVar71 & 0x1f) <
             (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [(uint)sb_size])) {
            iVar68 = iVar68 << (5 - bVar71 & 0x1f);
            uVar67 = iVar68 + iVar85;
            uVar96 = iVar68 + 7 + iVar85;
            if (-1 < (int)uVar67) {
              uVar96 = uVar67;
            }
            ppuVar94 = has_tr_tables;
            if ((pMVar10->partition & 0xfe) == 6) {
              ppuVar94 = has_tr_vert_tables;
            }
            uVar67 = (uint)((ppuVar94[BVar82][(int)uVar96 >> 3] >> (uVar67 & 7) & 1) != 0);
          }
        }
      }
      else {
        if ((BVar82 & ~BLOCK_4X8) == BLOCK_128X64) {
          uVar97 = 0x10 >> (bVar108 & 0x1f);
          uVar67 = 1;
          if (uVar96 == uVar97 && 0x10U >> (bVar2 & 0x1f) == row_off) goto LAB_0039f88b;
          iVar85 = col_off % (int)uVar97 + tx_size_wide_unit[uVar91];
          bVar109 = SBORROW4(iVar85,uVar97);
          iVar85 = iVar85 - uVar97;
        }
        else {
          bVar109 = SBORROW4(uVar96,iVar85);
          iVar85 = uVar96 - iVar85;
        }
        uVar67 = (uint)(bVar109 != iVar85 < 0);
      }
    }
    else {
      uVar67 = 0;
    }
  }
LAB_0039f88b:
  if (bVar84 != 0) {
    if ((bVar65 & bVar107) == 1) {
      if ((col_off < 1) || ((BVar82 & ~BLOCK_4X8) != BLOCK_128X64)) {
        if (0 < col_off) goto LAB_0039f940;
        uVar96 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [BVar82] >> (bVar2 & 0x1f));
        uVar93 = 1;
        if ((int)(uVar96 + (uVar96 == 0)) <= row_off + tx_size_high_unit[uVar91]) {
          bVar65 = ""[BVar82];
          bVar108 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [(uint)sb_size];
          iVar85 = (int)(uVar77 & bVar108 - 1) >> (bVar65 & 0x1f);
          iVar68 = (int)(uVar102 & bVar108 - 1) >> (""[BVar82] & 0x1f);
          if (iVar68 == 0) {
            uVar93 = (uint)(((iVar85 << (bVar65 & 0x1f)) >> (bVar2 & 0x1f)) +
                            row_off + tx_size_high_unit[uVar91] <
                           (int)(uint)(bVar108 >> (bVar2 & 0x1f)));
          }
          else {
            uVar93 = 0;
            if (iVar85 + 1 << (bVar65 & 0x1f) < (int)(uint)bVar108) {
              iVar85 = iVar85 << (5 - ""[BVar82] & 0x1f);
              uVar96 = iVar85 + iVar68;
              uVar77 = iVar85 + 7 + iVar68;
              if (-1 < (int)uVar96) {
                uVar77 = uVar96;
              }
              ppuVar94 = has_bl_tables;
              if ((pMVar10->partition & 0xfe) == 6) {
                ppuVar94 = has_bl_vert_tables;
              }
              uVar93 = (uint)((ppuVar94[BVar82][(int)uVar77 >> 3] >> (uVar96 & 7) & 1) != 0);
            }
          }
        }
      }
      else {
        uVar93 = 0;
        if (((0x10U >> (bVar108 & 0x1f)) + 0x7fffffff & col_off) == 0) {
          uVar96 = 0x10 >> (bVar2 & 0x1f);
          uVar77 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [BVar82] >> (bVar2 & 0x1f));
          if (uVar96 <= uVar77) {
            uVar77 = uVar96;
          }
          uVar93 = (uint)(row_off % (int)uVar96 + tx_size_high_unit[uVar91] < (int)uVar77);
        }
      }
    }
    else {
LAB_0039f940:
      uVar93 = 0;
    }
  }
  psVar11 = xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -8];
  psVar12 = xd->block_ref_scale_factors[(ulong)(plane != 0) * 2 + -7];
  if (psVar12 == (scale_factors *)0x0) {
LAB_0039f9ba:
    if (psVar11 == (scale_factors *)0x0) {
LAB_0039f9d7:
      uVar77 = 0;
    }
    else {
      if (plane == 0) {
        cVar63 = *(undefined1 *)((long)&psVar11->x_scale_fp + 2);
LAB_0039f9e4:
        bVar107 = (byte)(cVar63 - 9U) < 3;
      }
      else {
LAB_0039f9c4:
        if (((int)(psVar11[10].y_scale_fp & -0x80000000) == 0) &&
           ((char)psVar11[1].x_scale_fp < '\x01')) {
          cVar63 = *(undefined1 *)((long)&psVar11->x_scale_fp + 3);
          goto LAB_0039f9e4;
        }
        bVar107 = false;
      }
      uVar77 = (uint)bVar107;
    }
  }
  else {
    if (plane != 0) {
      if (((int)(psVar12[10].y_scale_fp & -0x80000000) == 0) &&
         ((char)psVar12[1].x_scale_fp < '\x01')) {
        lVar105 = 3;
        goto LAB_0039f9a9;
      }
      if (psVar11 != (scale_factors *)0x0) goto LAB_0039f9c4;
      goto LAB_0039f9d7;
    }
    lVar105 = 2;
LAB_0039f9a9:
    uVar77 = 1;
    if ((byte)(*(char *)((long)&psVar12->x_scale_fp + lVar105) - 0xcU) < 0xfd) goto LAB_0039f9ba;
  }
  uVar96 = uVar103 - uVar104;
  if ((int)uVar104 < (int)(uVar103 - uVar104)) {
    uVar96 = uVar104;
  }
  if ((int)uVar67 < 1) {
    uVar96 = uVar67;
  }
  if ((int)uVar78 < (int)uVar80) {
    uVar80 = uVar78;
  }
  if ((int)uVar93 < 1) {
    uVar80 = uVar93;
  }
  uVar103 = (uint)local_ba0;
  if ((uVar101 & 1) == 0) {
    lVar105 = (long)ref_stride;
    memset(left_data,0x81,0xa0);
    iVar85 = 0x39fa53;
    memset(left_data_2,0x7f,0xa0);
    if ((byte)(mode - 9) < 0xf8) {
      bVar65 = bVar64 & 2;
      bVar108 = bVar64 & 4;
      bVar64 = bVar64 & 0x10;
    }
    else {
      bVar65 = 0x5a < (int)uVar103;
      bVar108 = (int)uVar103 < 0xb4;
      bVar64 = 1;
    }
    pbVar106 = ref + -lVar105;
    pbVar75 = ref + -1;
    if (filter_intra_mode != '\x05') {
      bVar108 = 1;
      bVar65 = 1;
    }
    if ((bVar108 == 0 && iVar120 == 0) || (bVar65 == 0 && iVar69 == 0)) {
      if (bVar65 == 0) {
        if (iVar120 < 1) {
          bVar65 = 0x7f;
          goto LAB_003a03ac;
        }
      }
      else {
        pbVar75 = pbVar106;
        if (iVar69 < 1) {
          bVar65 = 0x81;
          goto LAB_003a03ac;
        }
      }
      bVar65 = *pbVar75;
LAB_003a03ac:
      uVar104 = 1;
      if (1 < (int)uVar78) {
        uVar104 = uVar78;
      }
      do {
        memset(dst,(uint)bVar65,__n);
        dst = dst + dst_stride;
        uVar104 = uVar104 - 1;
      } while (uVar104 != 0);
      return;
    }
    puVar92 = left_data + 8;
    if (bVar65 != 0) {
      uVar101 = 0;
      if (-1 < (int)uVar80) {
        uVar101 = uVar104;
      }
      iVar68 = uVar101 + uVar78;
      if (iVar120 < 1) {
        if (0 < iVar69) {
          bVar2 = *pbVar106;
          goto LAB_003a0500;
        }
      }
      else {
        uVar98 = 0;
        pbVar89 = pbVar75;
        do {
          *(byte *)((long)left_data + uVar98 + 0x10) = *pbVar89;
          uVar98 = uVar98 + 1;
          pbVar89 = pbVar89 + lVar105;
        } while (uVar73 != uVar98);
        iVar86 = iVar120;
        if ((0 < (int)uVar80) && (iVar120 < (int)(uVar80 + uVar78))) {
          puVar90 = ref + lVar105 * uVar73 + -1;
          do {
            *(uint8_t *)((long)left_data + uVar73 + 0x10) = *puVar90;
            uVar73 = uVar73 + 1;
            puVar90 = puVar90 + lVar105;
          } while ((long)uVar73 < (long)(int)(uVar80 + uVar78));
          iVar86 = (int)uVar73;
        }
        if (iVar68 - iVar86 != 0 && iVar86 <= iVar68) {
          puVar92 = (uint16_t *)((long)puVar92 + (long)iVar86);
          bVar2 = *(byte *)((long)left_data + (long)iVar86 + 0xf);
          iVar68 = iVar68 - iVar86;
LAB_003a0500:
          iVar85 = 0x3a0505;
          memset(puVar92,(uint)bVar2,(long)iVar68);
        }
      }
    }
    puVar92 = left_data_2 + 8;
    if (bVar108 != 0) {
      uVar101 = 0;
      if (-1 < (int)uVar96) {
        uVar101 = uVar78;
      }
      iVar68 = uVar101 + uVar104;
      if (iVar69 < 1) {
        if (0 < iVar120) {
          bVar2 = *pbVar75;
          puVar70 = puVar92;
          goto LAB_003a0bf8;
        }
      }
      else {
        iVar85 = 0x3a0550;
        memcpy(puVar92,pbVar106,__n_00);
        if (0 < (int)uVar96) {
          iVar85 = 0x3a0569;
          memcpy((uint8_t *)((long)puVar92 + __n),pbVar106 + __n,(ulong)uVar96);
          local_b94 = uVar96 + iVar69;
        }
        if (iVar68 - local_b94 != 0 && (int)local_b94 <= iVar68) {
          bVar2 = *(byte *)((long)left_data_2 + (ulong)local_b94 + 0xf);
          puVar70 = (uint16_t *)((long)puVar92 + (ulong)local_b94);
          iVar68 = iVar68 - local_b94;
LAB_003a0bf8:
          iVar85 = 0x3a0bfd;
          memset(puVar70,(uint)bVar2,(long)iVar68);
        }
      }
    }
    if ((filter_intra_mode != '\x05') || (bVar64 != 0)) {
      if ((iVar69 < 1) || (iVar120 < 1)) {
        if ((0 < iVar69) || (left_data_2[7]._1_1_ = 0x80, pbVar106 = pbVar75, 0 < iVar120))
        goto LAB_003a0c3c;
      }
      else {
        pbVar106 = pbVar106 + -1;
LAB_003a0c3c:
        left_data_2[7]._1_1_ = *pbVar106;
      }
      left_data[7]._1_1_ = left_data_2[7]._1_1_;
      if (filter_intra_mode != '\x05') {
        (*av1_filter_intra_predictor)
                  (dst,(long)dst_stride,tx_size,(uint8_t *)puVar92,(uint8_t *)(left_data + 8),
                   (uint)filter_intra_mode);
        return;
      }
    }
    if (enable_intra_edge_filter == 0) {
      uVar80 = 0;
      uVar101 = 0;
    }
    else {
      if ((uVar103 != 0x5a) && (uVar103 != 0xb4)) {
        if ((bVar108 != 0) && ((bVar65 != 0 && (0x17 < (int)(uVar78 + uVar104))))) {
          left_data_2[7]._1_1_ =
               (byte)(((uint)(byte)left_data_2[8] + (uint)(byte)left_data[8]) * 5 +
                      (uint)left_data_2[7]._1_1_ * 6 + 8 >> 4);
          left_data[7]._1_1_ = left_data_2[7]._1_1_;
        }
        if ((0 < iVar69) && (bVar108 != 0)) {
          iVar68 = intra_edge_filter_strength(uVar104,uVar78,uVar103 - 0x5a,uVar77);
          uVar101 = 0;
          if ((int)uVar103 < 0x5a) {
            uVar101 = uVar78;
          }
          iVar85 = 0x3a0d2c;
          (*av1_filter_intra_edge)((uint8_t *)((long)left_data_2 + 0xf),iVar69 + 1 + uVar101,iVar68)
          ;
        }
        if ((0 < iVar120) && (bVar65 != 0)) {
          iVar68 = intra_edge_filter_strength(uVar78,uVar104,uVar103 - 0xb4,uVar77);
          uVar101 = 0;
          if (0xb4 < (int)uVar103) {
            uVar101 = uVar104;
          }
          iVar85 = 0x3a0d87;
          (*av1_filter_intra_edge)((uint8_t *)((long)left_data + 0xf),iVar120 + 1 + uVar101,iVar68);
        }
      }
      uVar93 = uVar103 - 0x5a;
      uVar80 = 0;
      uVar96 = -uVar93;
      if (0 < (int)uVar93) {
        uVar96 = uVar93;
      }
      uVar101 = 0;
      if ((uVar93 != 0) && (uVar101 = 0, uVar96 < 0x28)) {
        iVar68 = (uint)(uVar77 == 0) * 8 + 9;
        uVar101 = (uint)((int)(uVar104 + uVar78) < iVar68);
        if ((bVar108 != 0) && ((int)(uVar104 + uVar78) < iVar68)) {
          uVar101 = 0;
          if ((int)uVar103 < 0x5a) {
            uVar101 = uVar78;
          }
          iVar85 = 0x3a0df5;
          (*av1_upsample_intra_edge)((uint8_t *)puVar92,uVar101 + uVar104);
          uVar101 = 1;
        }
      }
      uVar93 = uVar103 - 0xb4;
      uVar96 = -uVar93;
      if (0 < (int)uVar93) {
        uVar96 = uVar93;
      }
      if ((uVar93 != 0) && (uVar96 < 0x28)) {
        iVar68 = (uint)(uVar77 == 0) * 8 + 9;
        uVar80 = (uint)((int)(uVar104 + uVar78) < iVar68);
        if ((bVar65 != 0) && ((int)(uVar104 + uVar78) < iVar68)) {
          uVar80 = 0;
          if (0xb4 < (int)uVar103) {
            uVar80 = uVar104;
          }
          iVar85 = 0x3a0e61;
          (*av1_upsample_intra_edge)((uint8_t *)(left_data + 8),uVar80 + uVar78);
          uVar80 = 1;
        }
      }
    }
    lVar105 = (long)dst_stride;
    if (uVar103 - 1 < 0x59) {
      iVar68 = (int)dr_intra_derivative[local_ba0];
      pp_Var99 = &av1_dr_prediction_z1;
      puVar76 = left_data + 8;
      iVar69 = 1;
      goto LAB_003a262f;
    }
    if (uVar103 - 0x5b < 0x59) {
      (*av1_dr_prediction_z2)
                (dst,lVar105,uVar104,uVar78,(uint8_t *)puVar92,(uint8_t *)(left_data + 8),uVar101,
                 uVar80,(int)dr_intra_derivative[0xb4 - uVar103],
                 (int)dr_intra_derivative[uVar103 - 0x5a]);
      return;
    }
    if (0x58 < uVar103 - 0xb5) {
      if (uVar103 == 0xb4) {
        (*pred[2][uVar91])(dst,lVar105,(uint8_t *)puVar92,(uint8_t *)(left_data + 8));
        return;
      }
      if (uVar103 != 0x5a) {
        return;
      }
      (*pred[1][uVar91])(dst,lVar105,(uint8_t *)puVar92,(uint8_t *)(left_data + 8));
      return;
    }
    sVar3 = dr_intra_derivative[0x10e - uVar103];
    pp_Var99 = &av1_dr_prediction_z3;
    puVar76 = left_data + 8;
    uVar101 = uVar80;
  }
  else {
    iVar85 = xd->bd;
    lVar105 = (long)ref * 2;
    lVar74 = (long)ref_stride;
    iVar68 = 0x80 << ((char)iVar85 - 8U & 0x1f);
    uVar101 = iVar68 + 1;
    auVar112 = pshuflw(ZEXT416(uVar101),ZEXT416(uVar101),0);
    uVar110 = auVar112._0_4_;
    lVar72 = 0;
    do {
      *(undefined4 *)(left_data_2 + lVar72) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 2) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 4) = uVar110;
      *(undefined4 *)(left_data_2 + lVar72 + 6) = uVar110;
      lVar72 = lVar72 + 8;
    } while (lVar72 != 0xa0);
    dst = (uint8_t *)((long)dst * 2);
    bVar108 = bVar64 & 4;
    bVar65 = bVar64 & 2;
    uVar93 = iVar68 - 1;
    auVar112 = pshuflw(ZEXT416(uVar93),ZEXT416(uVar93),0);
    uVar110 = auVar112._0_4_;
    lVar72 = 0;
    do {
      lVar95 = lVar72 * 2;
      *(undefined4 *)((long)auStack_9f8 + lVar95) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar95 + 4) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar95 + 8) = uVar110;
      *(undefined4 *)((long)auStack_9f8 + lVar95 + 0xc) = uVar110;
      lVar72 = lVar72 + 8;
    } while (lVar72 != 0xa0);
    if ((byte)(mode - 9) < 0xf8) {
      bVar64 = bVar64 & 0x10;
    }
    else if ((int)uVar103 < 0x5b) {
      bVar65 = 0;
      bVar64 = 1;
      bVar108 = 1;
    }
    else {
      bVar108 = uVar103 < 0xb4;
      bVar64 = 1;
      bVar65 = 1;
    }
    puVar92 = (uint16_t *)(lVar105 + -2);
    puVar70 = (uint16_t *)(lVar105 + lVar74 * -2);
    if (filter_intra_mode != '\x05') {
      bVar108 = 1;
      bVar65 = 1;
    }
    if ((bVar108 == 0 && iVar120 == 0) || (bVar65 == 0 && iVar69 == 0)) {
      if (bVar65 != 0) {
        uVar93 = uVar101;
        puVar92 = puVar70;
        iVar120 = iVar69;
      }
      uVar66 = (uint16_t)uVar93;
      if (0 < iVar120) {
        uVar66 = *puVar92;
      }
      uVar104 = 1;
      if (1 < (int)uVar78) {
        uVar104 = uVar78;
      }
      lVar105 = __n - 1;
      auVar114._8_4_ = (int)lVar105;
      auVar114._0_8_ = lVar105;
      auVar114._12_4_ = (int)((ulong)lVar105 >> 0x20);
      uVar78 = 0;
      auVar114 = auVar114 ^ _DAT_004c8280;
      do {
        uVar91 = 0;
        do {
          auVar125._8_4_ = (int)uVar91;
          auVar125._0_8_ = uVar91;
          auVar125._12_4_ = (int)(uVar91 >> 0x20);
          auVar112 = (auVar125 | auVar267) ^ auVar286;
          iVar85 = auVar114._0_4_;
          iVar86 = -(uint)(iVar85 < auVar112._0_4_);
          iVar68 = auVar114._4_4_;
          auVar157._4_4_ = -(uint)(iVar68 < auVar112._4_4_);
          iVar69 = auVar114._8_4_;
          iVar81 = -(uint)(iVar69 < auVar112._8_4_);
          iVar120 = auVar114._12_4_;
          auVar157._12_4_ = -(uint)(iVar120 < auVar112._12_4_);
          auVar218._4_4_ = iVar86;
          auVar218._0_4_ = iVar86;
          auVar218._8_4_ = iVar81;
          auVar218._12_4_ = iVar81;
          auVar270 = pshuflw(in_XMM11,auVar218,0xe8);
          auVar156._4_4_ = -(uint)(auVar112._4_4_ == iVar68);
          auVar156._12_4_ = -(uint)(auVar112._12_4_ == iVar120);
          auVar156._0_4_ = auVar156._4_4_;
          auVar156._8_4_ = auVar156._12_4_;
          auVar287 = pshuflw(in_XMM12,auVar156,0xe8);
          auVar157._0_4_ = auVar157._4_4_;
          auVar157._8_4_ = auVar157._12_4_;
          auVar112 = pshuflw(auVar270,auVar157,0xe8);
          auVar271._8_4_ = 0xffffffff;
          auVar271._0_8_ = 0xffffffffffffffff;
          auVar271._12_4_ = 0xffffffff;
          auVar271 = (auVar112 | auVar287 & auVar270) ^ auVar271;
          auVar112 = packssdw(auVar271,auVar271);
          if ((auVar112 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar91 * 2) = uVar66;
          }
          auVar157 = auVar156 & auVar218 | auVar157;
          auVar112 = packssdw(auVar157,auVar157);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 ^ auVar33,auVar112 ^ auVar33);
          if ((auVar112._0_4_ >> 0x10 & 1) != 0) {
            *(uint16_t *)((long)dst + (uVar91 + 1) * 2) = uVar66;
          }
          auVar112 = (auVar125 | auVar146) ^ auVar286;
          iVar86 = -(uint)(iVar85 < auVar112._0_4_);
          auVar256._4_4_ = -(uint)(iVar68 < auVar112._4_4_);
          iVar81 = -(uint)(iVar69 < auVar112._8_4_);
          auVar256._12_4_ = -(uint)(iVar120 < auVar112._12_4_);
          auVar158._4_4_ = iVar86;
          auVar158._0_4_ = iVar86;
          auVar158._8_4_ = iVar81;
          auVar158._12_4_ = iVar81;
          auVar219._4_4_ = -(uint)(auVar112._4_4_ == iVar68);
          auVar219._12_4_ = -(uint)(auVar112._12_4_ == iVar120);
          auVar219._0_4_ = auVar219._4_4_;
          auVar219._8_4_ = auVar219._12_4_;
          auVar256._0_4_ = auVar256._4_4_;
          auVar256._8_4_ = auVar256._12_4_;
          auVar112 = auVar219 & auVar158 | auVar256;
          auVar112 = packssdw(auVar112,auVar112);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 ^ auVar34,auVar112 ^ auVar34);
          if ((auVar112 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 2) * 2) = uVar66;
          }
          auVar159 = pshufhw(auVar158,auVar158,0x84);
          auVar220 = pshufhw(auVar219,auVar219,0x84);
          auVar160 = pshufhw(auVar159,auVar256,0x84);
          auVar161._8_4_ = 0xffffffff;
          auVar161._0_8_ = 0xffffffffffffffff;
          auVar161._12_4_ = 0xffffffff;
          auVar161 = (auVar160 | auVar220 & auVar159) ^ auVar161;
          auVar159 = packssdw(auVar161,auVar161);
          if ((auVar159 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 3) * 2) = uVar66;
          }
          auVar159 = (auVar125 | auVar151) ^ auVar286;
          iVar86 = -(uint)(iVar85 < auVar159._0_4_);
          auVar163._4_4_ = -(uint)(iVar68 < auVar159._4_4_);
          iVar81 = -(uint)(iVar69 < auVar159._8_4_);
          auVar163._12_4_ = -(uint)(iVar120 < auVar159._12_4_);
          auVar221._4_4_ = iVar86;
          auVar221._0_4_ = iVar86;
          auVar221._8_4_ = iVar81;
          auVar221._12_4_ = iVar81;
          auVar112 = pshuflw(auVar112,auVar221,0xe8);
          auVar162._4_4_ = -(uint)(auVar159._4_4_ == iVar68);
          auVar162._12_4_ = -(uint)(auVar159._12_4_ == iVar120);
          auVar162._0_4_ = auVar162._4_4_;
          auVar162._8_4_ = auVar162._12_4_;
          auVar270 = pshuflw(auVar287 & auVar270,auVar162,0xe8);
          in_XMM12 = auVar270 & auVar112;
          auVar163._0_4_ = auVar163._4_4_;
          auVar163._8_4_ = auVar163._12_4_;
          auVar112 = pshuflw(auVar112,auVar163,0xe8);
          auVar272._8_4_ = 0xffffffff;
          auVar272._0_8_ = 0xffffffffffffffff;
          auVar272._12_4_ = 0xffffffff;
          auVar272 = (auVar112 | in_XMM12) ^ auVar272;
          in_XMM11 = packssdw(auVar272,auVar272);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 4) * 2) = uVar66;
          }
          auVar163 = auVar162 & auVar221 | auVar163;
          auVar112 = packssdw(auVar163,auVar163);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 ^ auVar35,auVar112 ^ auVar35);
          if ((auVar112 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 5) * 2) = uVar66;
          }
          auVar112 = (auVar125 | auVar150) ^ auVar286;
          iVar85 = -(uint)(iVar85 < auVar112._0_4_);
          auVar222._4_4_ = -(uint)(iVar68 < auVar112._4_4_);
          iVar69 = -(uint)(iVar69 < auVar112._8_4_);
          auVar222._12_4_ = -(uint)(iVar120 < auVar112._12_4_);
          auVar164._4_4_ = iVar85;
          auVar164._0_4_ = iVar85;
          auVar164._8_4_ = iVar69;
          auVar164._12_4_ = iVar69;
          auVar126._4_4_ = -(uint)(auVar112._4_4_ == iVar68);
          auVar126._12_4_ = -(uint)(auVar112._12_4_ == iVar120);
          auVar126._0_4_ = auVar126._4_4_;
          auVar126._8_4_ = auVar126._12_4_;
          auVar222._0_4_ = auVar222._4_4_;
          auVar222._8_4_ = auVar222._12_4_;
          auVar112 = auVar126 & auVar164 | auVar222;
          auVar112 = packssdw(auVar112,auVar112);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 ^ auVar36,auVar112 ^ auVar36);
          if ((auVar112 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 6) * 2) = uVar66;
          }
          auVar270 = pshufhw(auVar164,auVar164,0x84);
          auVar112 = pshufhw(auVar126,auVar126,0x84);
          auVar287 = pshufhw(auVar270,auVar222,0x84);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 & auVar270,(auVar287 | auVar112 & auVar270) ^ auVar37);
          if ((auVar112 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + (uVar91 + 7) * 2) = uVar66;
          }
          uVar91 = uVar91 + 8;
        } while ((__n + 7 & 0xfffffffffffffff8) != uVar91);
        uVar78 = uVar78 + 1;
        dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
      } while (uVar78 != uVar104);
      return;
    }
    if (bVar65 != 0) {
      uVar101 = 0;
      if (-1 < (int)uVar80) {
        uVar101 = uVar104;
      }
      iVar86 = uVar101 + uVar78;
      if (iVar120 < 1) {
        if ((0 < iVar69) && (iVar86 != 0)) {
          uVar66 = *puVar70;
          lVar105 = (long)iVar86 + -1;
          auVar115._8_4_ = (int)lVar105;
          auVar115._0_8_ = lVar105;
          auVar115._12_4_ = (int)((ulong)lVar105 >> 0x20);
          uVar73 = 0;
          auVar115 = auVar115 ^ _DAT_004c8280;
          do {
            auVar127._8_4_ = (int)uVar73;
            auVar127._0_8_ = uVar73;
            auVar127._12_4_ = (int)(uVar73 >> 0x20);
            auVar146 = (auVar127 | _DAT_004c8270) ^ _DAT_004c8280;
            iVar81 = auVar115._0_4_;
            iVar253 = -(uint)(iVar81 < auVar146._0_4_);
            iVar87 = auVar115._4_4_;
            auVar166._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = auVar115._8_4_;
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            iVar250 = auVar115._12_4_;
            auVar166._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar223._4_4_ = iVar253;
            auVar223._0_4_ = iVar253;
            auVar223._8_4_ = iVar252;
            auVar223._12_4_ = iVar252;
            auVar267 = pshuflw(in_XMM11,auVar223,0xe8);
            auVar165._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar165._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar165._0_4_ = auVar165._4_4_;
            auVar165._8_4_ = auVar165._12_4_;
            auVar286 = pshuflw(in_XMM12,auVar165,0xe8);
            auVar166._0_4_ = auVar166._4_4_;
            auVar166._8_4_ = auVar166._12_4_;
            auVar146 = pshuflw(auVar267,auVar166,0xe8);
            auVar273._8_4_ = 0xffffffff;
            auVar273._0_8_ = 0xffffffffffffffff;
            auVar273._12_4_ = 0xffffffff;
            auVar273 = (auVar146 | auVar286 & auVar267) ^ auVar273;
            auVar146 = packssdw(auVar273,auVar273);
            if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x10] = uVar66;
            }
            auVar166 = auVar165 & auVar223 | auVar166;
            auVar146 = packssdw(auVar166,auVar166);
            auVar28._8_4_ = 0xffffffff;
            auVar28._0_8_ = 0xffffffffffffffff;
            auVar28._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar28,auVar146 ^ auVar28);
            if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
              left_data_2[uVar73 + 0x11] = uVar66;
            }
            auVar146 = (auVar127 | _DAT_004c8260) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar81 < auVar146._0_4_);
            auVar257._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            auVar257._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar167._4_4_ = iVar253;
            auVar167._0_4_ = iVar253;
            auVar167._8_4_ = iVar252;
            auVar167._12_4_ = iVar252;
            auVar224._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar224._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar224._0_4_ = auVar224._4_4_;
            auVar224._8_4_ = auVar224._12_4_;
            auVar257._0_4_ = auVar257._4_4_;
            auVar257._8_4_ = auVar257._12_4_;
            auVar146 = auVar224 & auVar167 | auVar257;
            auVar146 = packssdw(auVar146,auVar146);
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar29,auVar146 ^ auVar29);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x12] = uVar66;
            }
            auVar150 = pshufhw(auVar167,auVar167,0x84);
            auVar112 = pshufhw(auVar224,auVar224,0x84);
            auVar151 = pshufhw(auVar150,auVar257,0x84);
            auVar168._8_4_ = 0xffffffff;
            auVar168._0_8_ = 0xffffffffffffffff;
            auVar168._12_4_ = 0xffffffff;
            auVar168 = (auVar151 | auVar112 & auVar150) ^ auVar168;
            auVar150 = packssdw(auVar168,auVar168);
            if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x13] = uVar66;
            }
            auVar150 = (auVar127 | _DAT_004c9e30) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar81 < auVar150._0_4_);
            auVar170._4_4_ = -(uint)(iVar87 < auVar150._4_4_);
            iVar252 = -(uint)(iVar251 < auVar150._8_4_);
            auVar170._12_4_ = -(uint)(iVar250 < auVar150._12_4_);
            auVar225._4_4_ = iVar253;
            auVar225._0_4_ = iVar253;
            auVar225._8_4_ = iVar252;
            auVar225._12_4_ = iVar252;
            auVar146 = pshuflw(auVar146,auVar225,0xe8);
            auVar169._4_4_ = -(uint)(auVar150._4_4_ == iVar87);
            auVar169._12_4_ = -(uint)(auVar150._12_4_ == iVar250);
            auVar169._0_4_ = auVar169._4_4_;
            auVar169._8_4_ = auVar169._12_4_;
            auVar267 = pshuflw(auVar286 & auVar267,auVar169,0xe8);
            in_XMM12 = auVar267 & auVar146;
            auVar170._0_4_ = auVar170._4_4_;
            auVar170._8_4_ = auVar170._12_4_;
            auVar146 = pshuflw(auVar146,auVar170,0xe8);
            auVar274._8_4_ = 0xffffffff;
            auVar274._0_8_ = 0xffffffffffffffff;
            auVar274._12_4_ = 0xffffffff;
            auVar274 = (auVar146 | in_XMM12) ^ auVar274;
            in_XMM11 = packssdw(auVar274,auVar274);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x14] = uVar66;
            }
            auVar170 = auVar169 & auVar225 | auVar170;
            auVar146 = packssdw(auVar170,auVar170);
            auVar30._8_4_ = 0xffffffff;
            auVar30._0_8_ = 0xffffffffffffffff;
            auVar30._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar30,auVar146 ^ auVar30);
            if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x15] = uVar66;
            }
            auVar146 = (auVar127 | _DAT_004c9e20) ^ _DAT_004c8280;
            iVar81 = -(uint)(iVar81 < auVar146._0_4_);
            auVar226._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = -(uint)(iVar251 < auVar146._8_4_);
            auVar226._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar171._4_4_ = iVar81;
            auVar171._0_4_ = iVar81;
            auVar171._8_4_ = iVar251;
            auVar171._12_4_ = iVar251;
            auVar128._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar128._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar128._0_4_ = auVar128._4_4_;
            auVar128._8_4_ = auVar128._12_4_;
            auVar226._0_4_ = auVar226._4_4_;
            auVar226._8_4_ = auVar226._12_4_;
            auVar146 = auVar128 & auVar171 | auVar226;
            auVar146 = packssdw(auVar146,auVar146);
            auVar31._8_4_ = 0xffffffff;
            auVar31._0_8_ = 0xffffffffffffffff;
            auVar31._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar31,auVar146 ^ auVar31);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x16] = uVar66;
            }
            auVar267 = pshufhw(auVar171,auVar171,0x84);
            auVar146 = pshufhw(auVar128,auVar128,0x84);
            auVar286 = pshufhw(auVar267,auVar226,0x84);
            auVar32._8_4_ = 0xffffffff;
            auVar32._0_8_ = 0xffffffffffffffff;
            auVar32._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar32);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[uVar73 + 0x17] = uVar66;
            }
            uVar73 = uVar73 + 8;
          } while (((long)iVar86 + 7U & 0xfffffffffffffff8) != uVar73);
        }
      }
      else {
        uVar98 = 0;
        puVar76 = puVar92;
        do {
          left_data_2[uVar98 + 0x10] = *puVar76;
          uVar98 = uVar98 + 1;
          puVar76 = puVar76 + lVar74;
        } while (uVar73 != uVar98);
        iVar81 = iVar120;
        if ((0 < (int)uVar80) && (iVar120 < (int)(uVar80 + uVar78))) {
          puVar76 = (uint16_t *)(lVar105 + lVar74 * uVar73 * 2 + -2);
          do {
            left_data_2[uVar73 + 0x10] = *puVar76;
            uVar73 = uVar73 + 1;
            puVar76 = puVar76 + lVar74;
          } while ((long)uVar73 < (long)(int)(uVar80 + uVar78));
          iVar81 = (int)uVar73;
        }
        iVar87 = iVar86 - iVar81;
        if (iVar87 != 0 && iVar81 <= iVar86) {
          uVar66 = left_data_2[(long)iVar81 + 0xf];
          lVar105 = (long)iVar87 + -1;
          auVar113._8_4_ = (int)lVar105;
          auVar113._0_8_ = lVar105;
          auVar113._12_4_ = (int)((ulong)lVar105 >> 0x20);
          uVar73 = 0;
          auVar113 = auVar113 ^ _DAT_004c8280;
          do {
            auVar123._8_4_ = (int)uVar73;
            auVar123._0_8_ = uVar73;
            auVar123._12_4_ = (int)(uVar73 >> 0x20);
            auVar146 = (auVar123 | _DAT_004c8270) ^ _DAT_004c8280;
            iVar86 = auVar113._0_4_;
            iVar252 = -(uint)(iVar86 < auVar146._0_4_);
            iVar251 = auVar113._4_4_;
            auVar148._4_4_ = -(uint)(iVar251 < auVar146._4_4_);
            iVar250 = auVar113._8_4_;
            iVar264 = -(uint)(iVar250 < auVar146._8_4_);
            iVar253 = auVar113._12_4_;
            auVar148._12_4_ = -(uint)(iVar253 < auVar146._12_4_);
            auVar214._4_4_ = iVar252;
            auVar214._0_4_ = iVar252;
            auVar214._8_4_ = iVar264;
            auVar214._12_4_ = iVar264;
            auVar267 = pshuflw(in_XMM11,auVar214,0xe8);
            auVar147._4_4_ = -(uint)(auVar146._4_4_ == iVar251);
            auVar147._12_4_ = -(uint)(auVar146._12_4_ == iVar253);
            auVar147._0_4_ = auVar147._4_4_;
            auVar147._8_4_ = auVar147._12_4_;
            auVar286 = pshuflw(in_XMM12,auVar147,0xe8);
            auVar148._0_4_ = auVar148._4_4_;
            auVar148._8_4_ = auVar148._12_4_;
            auVar146 = pshuflw(auVar267,auVar148,0xe8);
            auVar268._8_4_ = 0xffffffff;
            auVar268._0_8_ = 0xffffffffffffffff;
            auVar268._12_4_ = 0xffffffff;
            auVar268 = (auVar146 | auVar286 & auVar267) ^ auVar268;
            auVar146 = packssdw(auVar268,auVar268);
            if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x10] = uVar66;
            }
            auVar148 = auVar147 & auVar214 | auVar148;
            auVar146 = packssdw(auVar148,auVar148);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar13,auVar146 ^ auVar13);
            if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
              left_data_2[(long)iVar81 + uVar73 + 0x11] = uVar66;
            }
            auVar146 = (auVar123 | _DAT_004c8260) ^ _DAT_004c8280;
            iVar252 = -(uint)(iVar86 < auVar146._0_4_);
            auVar255._4_4_ = -(uint)(iVar251 < auVar146._4_4_);
            iVar264 = -(uint)(iVar250 < auVar146._8_4_);
            auVar255._12_4_ = -(uint)(iVar253 < auVar146._12_4_);
            auVar149._4_4_ = iVar252;
            auVar149._0_4_ = iVar252;
            auVar149._8_4_ = iVar264;
            auVar149._12_4_ = iVar264;
            auVar215._4_4_ = -(uint)(auVar146._4_4_ == iVar251);
            auVar215._12_4_ = -(uint)(auVar146._12_4_ == iVar253);
            auVar215._0_4_ = auVar215._4_4_;
            auVar215._8_4_ = auVar215._12_4_;
            auVar255._0_4_ = auVar255._4_4_;
            auVar255._8_4_ = auVar255._12_4_;
            auVar146 = auVar215 & auVar149 | auVar255;
            auVar146 = packssdw(auVar146,auVar146);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar14,auVar146 ^ auVar14);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x12] = uVar66;
            }
            auVar150 = pshufhw(auVar149,auVar149,0x84);
            auVar112 = pshufhw(auVar215,auVar215,0x84);
            auVar151 = pshufhw(auVar150,auVar255,0x84);
            auVar152._8_4_ = 0xffffffff;
            auVar152._0_8_ = 0xffffffffffffffff;
            auVar152._12_4_ = 0xffffffff;
            auVar152 = (auVar151 | auVar112 & auVar150) ^ auVar152;
            auVar150 = packssdw(auVar152,auVar152);
            if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x13] = uVar66;
            }
            auVar150 = (auVar123 | _DAT_004c9e30) ^ _DAT_004c8280;
            iVar252 = -(uint)(iVar86 < auVar150._0_4_);
            auVar154._4_4_ = -(uint)(iVar251 < auVar150._4_4_);
            iVar264 = -(uint)(iVar250 < auVar150._8_4_);
            auVar154._12_4_ = -(uint)(iVar253 < auVar150._12_4_);
            auVar216._4_4_ = iVar252;
            auVar216._0_4_ = iVar252;
            auVar216._8_4_ = iVar264;
            auVar216._12_4_ = iVar264;
            auVar146 = pshuflw(auVar146,auVar216,0xe8);
            auVar153._4_4_ = -(uint)(auVar150._4_4_ == iVar251);
            auVar153._12_4_ = -(uint)(auVar150._12_4_ == iVar253);
            auVar153._0_4_ = auVar153._4_4_;
            auVar153._8_4_ = auVar153._12_4_;
            auVar267 = pshuflw(auVar286 & auVar267,auVar153,0xe8);
            in_XMM12 = auVar267 & auVar146;
            auVar154._0_4_ = auVar154._4_4_;
            auVar154._8_4_ = auVar154._12_4_;
            auVar146 = pshuflw(auVar146,auVar154,0xe8);
            auVar269._8_4_ = 0xffffffff;
            auVar269._0_8_ = 0xffffffffffffffff;
            auVar269._12_4_ = 0xffffffff;
            auVar269 = (auVar146 | in_XMM12) ^ auVar269;
            in_XMM11 = packssdw(auVar269,auVar269);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x14] = uVar66;
            }
            auVar154 = auVar153 & auVar216 | auVar154;
            auVar146 = packssdw(auVar154,auVar154);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar15,auVar146 ^ auVar15);
            if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x15] = uVar66;
            }
            auVar146 = (auVar123 | _DAT_004c9e20) ^ _DAT_004c8280;
            iVar86 = -(uint)(iVar86 < auVar146._0_4_);
            auVar217._4_4_ = -(uint)(iVar251 < auVar146._4_4_);
            iVar250 = -(uint)(iVar250 < auVar146._8_4_);
            auVar217._12_4_ = -(uint)(iVar253 < auVar146._12_4_);
            auVar155._4_4_ = iVar86;
            auVar155._0_4_ = iVar86;
            auVar155._8_4_ = iVar250;
            auVar155._12_4_ = iVar250;
            auVar124._4_4_ = -(uint)(auVar146._4_4_ == iVar251);
            auVar124._12_4_ = -(uint)(auVar146._12_4_ == iVar253);
            auVar124._0_4_ = auVar124._4_4_;
            auVar124._8_4_ = auVar124._12_4_;
            auVar217._0_4_ = auVar217._4_4_;
            auVar217._8_4_ = auVar217._12_4_;
            auVar146 = auVar124 & auVar155 | auVar217;
            auVar146 = packssdw(auVar146,auVar146);
            auVar16._8_4_ = 0xffffffff;
            auVar16._0_8_ = 0xffffffffffffffff;
            auVar16._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar16,auVar146 ^ auVar16);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x16] = uVar66;
            }
            auVar267 = pshufhw(auVar155,auVar155,0x84);
            auVar146 = pshufhw(auVar124,auVar124,0x84);
            auVar286 = pshufhw(auVar267,auVar217,0x84);
            auVar17._8_4_ = 0xffffffff;
            auVar17._0_8_ = 0xffffffffffffffff;
            auVar17._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar17);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              left_data_2[(long)iVar81 + uVar73 + 0x17] = uVar66;
            }
            uVar73 = uVar73 + 8;
          } while (((long)iVar87 + 7U & 0xfffffffffffffff8) != uVar73);
        }
      }
    }
    if (bVar108 != 0) {
      uVar101 = 0;
      if (-1 < (int)uVar96) {
        uVar101 = uVar78;
      }
      iVar86 = uVar101 + uVar104;
      if (iVar69 < 1) {
        if ((0 < iVar120) && (iVar86 != 0)) {
          uVar66 = *puVar92;
          lVar105 = (long)iVar86 + -1;
          auVar117._8_4_ = (int)lVar105;
          auVar117._0_8_ = lVar105;
          auVar117._12_4_ = (int)((ulong)lVar105 >> 0x20);
          uVar73 = 0;
          auVar117 = auVar117 ^ _DAT_004c8280;
          do {
            auVar131._8_4_ = (int)uVar73;
            auVar131._0_8_ = uVar73;
            auVar131._12_4_ = (int)(uVar73 >> 0x20);
            auVar146 = (auVar131 | _DAT_004c8270) ^ _DAT_004c8280;
            iVar81 = auVar117._0_4_;
            iVar253 = -(uint)(iVar81 < auVar146._0_4_);
            iVar87 = auVar117._4_4_;
            auVar180._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = auVar117._8_4_;
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            iVar250 = auVar117._12_4_;
            auVar180._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar231._4_4_ = iVar253;
            auVar231._0_4_ = iVar253;
            auVar231._8_4_ = iVar252;
            auVar231._12_4_ = iVar252;
            auVar267 = pshuflw(in_XMM11,auVar231,0xe8);
            auVar179._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar179._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar179._0_4_ = auVar179._4_4_;
            auVar179._8_4_ = auVar179._12_4_;
            auVar286 = pshuflw(in_XMM12,auVar179,0xe8);
            auVar180._0_4_ = auVar180._4_4_;
            auVar180._8_4_ = auVar180._12_4_;
            auVar146 = pshuflw(auVar267,auVar180,0xe8);
            auVar277._8_4_ = 0xffffffff;
            auVar277._0_8_ = 0xffffffffffffffff;
            auVar277._12_4_ = 0xffffffff;
            auVar277 = (auVar146 | auVar286 & auVar267) ^ auVar277;
            auVar146 = packssdw(auVar277,auVar277);
            if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 1] = uVar66;
            }
            auVar180 = auVar179 & auVar231 | auVar180;
            auVar146 = packssdw(auVar180,auVar180);
            auVar23._8_4_ = 0xffffffff;
            auVar23._0_8_ = 0xffffffffffffffff;
            auVar23._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar23,auVar146 ^ auVar23);
            if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
              (&local_9da)[uVar73 + 2] = uVar66;
            }
            auVar146 = (auVar131 | _DAT_004c8260) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar81 < auVar146._0_4_);
            auVar259._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            auVar259._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar181._4_4_ = iVar253;
            auVar181._0_4_ = iVar253;
            auVar181._8_4_ = iVar252;
            auVar181._12_4_ = iVar252;
            auVar232._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar232._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar232._0_4_ = auVar232._4_4_;
            auVar232._8_4_ = auVar232._12_4_;
            auVar259._0_4_ = auVar259._4_4_;
            auVar259._8_4_ = auVar259._12_4_;
            auVar146 = auVar232 & auVar181 | auVar259;
            auVar146 = packssdw(auVar146,auVar146);
            auVar24._8_4_ = 0xffffffff;
            auVar24._0_8_ = 0xffffffffffffffff;
            auVar24._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar24,auVar146 ^ auVar24);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 3] = uVar66;
            }
            auVar150 = pshufhw(auVar181,auVar181,0x84);
            auVar112 = pshufhw(auVar232,auVar232,0x84);
            auVar151 = pshufhw(auVar150,auVar259,0x84);
            auVar182._8_4_ = 0xffffffff;
            auVar182._0_8_ = 0xffffffffffffffff;
            auVar182._12_4_ = 0xffffffff;
            auVar182 = (auVar151 | auVar112 & auVar150) ^ auVar182;
            auVar150 = packssdw(auVar182,auVar182);
            if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 4] = uVar66;
            }
            auVar150 = (auVar131 | _DAT_004c9e30) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar81 < auVar150._0_4_);
            auVar184._4_4_ = -(uint)(iVar87 < auVar150._4_4_);
            iVar252 = -(uint)(iVar251 < auVar150._8_4_);
            auVar184._12_4_ = -(uint)(iVar250 < auVar150._12_4_);
            auVar233._4_4_ = iVar253;
            auVar233._0_4_ = iVar253;
            auVar233._8_4_ = iVar252;
            auVar233._12_4_ = iVar252;
            auVar146 = pshuflw(auVar146,auVar233,0xe8);
            auVar183._4_4_ = -(uint)(auVar150._4_4_ == iVar87);
            auVar183._12_4_ = -(uint)(auVar150._12_4_ == iVar250);
            auVar183._0_4_ = auVar183._4_4_;
            auVar183._8_4_ = auVar183._12_4_;
            auVar267 = pshuflw(auVar286 & auVar267,auVar183,0xe8);
            in_XMM12 = auVar267 & auVar146;
            auVar184._0_4_ = auVar184._4_4_;
            auVar184._8_4_ = auVar184._12_4_;
            auVar146 = pshuflw(auVar146,auVar184,0xe8);
            auVar278._8_4_ = 0xffffffff;
            auVar278._0_8_ = 0xffffffffffffffff;
            auVar278._12_4_ = 0xffffffff;
            auVar278 = (auVar146 | in_XMM12) ^ auVar278;
            in_XMM11 = packssdw(auVar278,auVar278);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 5] = uVar66;
            }
            auVar184 = auVar183 & auVar233 | auVar184;
            auVar146 = packssdw(auVar184,auVar184);
            auVar25._8_4_ = 0xffffffff;
            auVar25._0_8_ = 0xffffffffffffffff;
            auVar25._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar25,auVar146 ^ auVar25);
            if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 6] = uVar66;
            }
            auVar146 = (auVar131 | _DAT_004c9e20) ^ _DAT_004c8280;
            iVar81 = -(uint)(iVar81 < auVar146._0_4_);
            auVar234._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = -(uint)(iVar251 < auVar146._8_4_);
            auVar234._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar185._4_4_ = iVar81;
            auVar185._0_4_ = iVar81;
            auVar185._8_4_ = iVar251;
            auVar185._12_4_ = iVar251;
            auVar132._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar132._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar132._0_4_ = auVar132._4_4_;
            auVar132._8_4_ = auVar132._12_4_;
            auVar234._0_4_ = auVar234._4_4_;
            auVar234._8_4_ = auVar234._12_4_;
            auVar146 = auVar132 & auVar185 | auVar234;
            auVar146 = packssdw(auVar146,auVar146);
            auVar26._8_4_ = 0xffffffff;
            auVar26._0_8_ = 0xffffffffffffffff;
            auVar26._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar26,auVar146 ^ auVar26);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 7] = uVar66;
            }
            auVar267 = pshufhw(auVar185,auVar185,0x84);
            auVar146 = pshufhw(auVar132,auVar132,0x84);
            auVar286 = pshufhw(auVar267,auVar234,0x84);
            auVar27._8_4_ = 0xffffffff;
            auVar27._0_8_ = 0xffffffffffffffff;
            auVar27._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar27);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + 8] = uVar66;
            }
            uVar73 = uVar73 + 8;
          } while (((long)iVar86 + 7U & 0xfffffffffffffff8) != uVar73);
        }
      }
      else {
        memcpy(&local_9d8,puVar70,(ulong)(uint)(iVar69 * 2));
        if (0 < (int)uVar96) {
          memcpy(&local_9d8 + __n,puVar70 + __n,(ulong)(uVar96 * 2));
          local_b94 = uVar96 + iVar69;
        }
        iVar81 = iVar86 - local_b94;
        if (iVar81 != 0 && (int)local_b94 <= iVar86) {
          uVar73 = (ulong)local_b94;
          uVar66 = (&local_9da)[uVar73];
          lVar105 = (long)iVar81 + -1;
          auVar116._8_4_ = (int)lVar105;
          auVar116._0_8_ = lVar105;
          auVar116._12_4_ = (int)((ulong)lVar105 >> 0x20);
          uVar98 = 0;
          auVar116 = auVar116 ^ _DAT_004c8280;
          do {
            auVar129._8_4_ = (int)uVar98;
            auVar129._0_8_ = uVar98;
            auVar129._12_4_ = (int)(uVar98 >> 0x20);
            auVar146 = (auVar129 | _DAT_004c8270) ^ _DAT_004c8280;
            iVar86 = auVar116._0_4_;
            iVar253 = -(uint)(iVar86 < auVar146._0_4_);
            iVar87 = auVar116._4_4_;
            auVar173._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = auVar116._8_4_;
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            iVar250 = auVar116._12_4_;
            auVar173._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar227._4_4_ = iVar253;
            auVar227._0_4_ = iVar253;
            auVar227._8_4_ = iVar252;
            auVar227._12_4_ = iVar252;
            auVar267 = pshuflw(in_XMM11,auVar227,0xe8);
            auVar172._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar172._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar172._0_4_ = auVar172._4_4_;
            auVar172._8_4_ = auVar172._12_4_;
            auVar286 = pshuflw(in_XMM12,auVar172,0xe8);
            auVar173._0_4_ = auVar173._4_4_;
            auVar173._8_4_ = auVar173._12_4_;
            auVar146 = pshuflw(auVar267,auVar173,0xe8);
            auVar275._8_4_ = 0xffffffff;
            auVar275._0_8_ = 0xffffffffffffffff;
            auVar275._12_4_ = 0xffffffff;
            auVar275 = (auVar146 | auVar286 & auVar267) ^ auVar275;
            auVar146 = packssdw(auVar275,auVar275);
            if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 1] = uVar66;
            }
            auVar173 = auVar172 & auVar227 | auVar173;
            auVar146 = packssdw(auVar173,auVar173);
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar18,auVar146 ^ auVar18);
            if ((auVar146._0_4_ >> 0x10 & 1) != 0) {
              (&local_9da)[uVar73 + uVar98 + 2] = uVar66;
            }
            auVar146 = (auVar129 | _DAT_004c8260) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar86 < auVar146._0_4_);
            auVar258._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar252 = -(uint)(iVar251 < auVar146._8_4_);
            auVar258._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar174._4_4_ = iVar253;
            auVar174._0_4_ = iVar253;
            auVar174._8_4_ = iVar252;
            auVar174._12_4_ = iVar252;
            auVar228._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar228._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar228._0_4_ = auVar228._4_4_;
            auVar228._8_4_ = auVar228._12_4_;
            auVar258._0_4_ = auVar258._4_4_;
            auVar258._8_4_ = auVar258._12_4_;
            auVar146 = auVar228 & auVar174 | auVar258;
            auVar146 = packssdw(auVar146,auVar146);
            auVar19._8_4_ = 0xffffffff;
            auVar19._0_8_ = 0xffffffffffffffff;
            auVar19._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar19,auVar146 ^ auVar19);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 3] = uVar66;
            }
            auVar150 = pshufhw(auVar174,auVar174,0x84);
            auVar112 = pshufhw(auVar228,auVar228,0x84);
            auVar151 = pshufhw(auVar150,auVar258,0x84);
            auVar175._8_4_ = 0xffffffff;
            auVar175._0_8_ = 0xffffffffffffffff;
            auVar175._12_4_ = 0xffffffff;
            auVar175 = (auVar151 | auVar112 & auVar150) ^ auVar175;
            auVar150 = packssdw(auVar175,auVar175);
            if ((auVar150 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 4] = uVar66;
            }
            auVar150 = (auVar129 | _DAT_004c9e30) ^ _DAT_004c8280;
            iVar253 = -(uint)(iVar86 < auVar150._0_4_);
            auVar177._4_4_ = -(uint)(iVar87 < auVar150._4_4_);
            iVar252 = -(uint)(iVar251 < auVar150._8_4_);
            auVar177._12_4_ = -(uint)(iVar250 < auVar150._12_4_);
            auVar229._4_4_ = iVar253;
            auVar229._0_4_ = iVar253;
            auVar229._8_4_ = iVar252;
            auVar229._12_4_ = iVar252;
            auVar146 = pshuflw(auVar146,auVar229,0xe8);
            auVar176._4_4_ = -(uint)(auVar150._4_4_ == iVar87);
            auVar176._12_4_ = -(uint)(auVar150._12_4_ == iVar250);
            auVar176._0_4_ = auVar176._4_4_;
            auVar176._8_4_ = auVar176._12_4_;
            auVar267 = pshuflw(auVar286 & auVar267,auVar176,0xe8);
            in_XMM12 = auVar267 & auVar146;
            auVar177._0_4_ = auVar177._4_4_;
            auVar177._8_4_ = auVar177._12_4_;
            auVar146 = pshuflw(auVar146,auVar177,0xe8);
            auVar276._8_4_ = 0xffffffff;
            auVar276._0_8_ = 0xffffffffffffffff;
            auVar276._12_4_ = 0xffffffff;
            auVar276 = (auVar146 | in_XMM12) ^ auVar276;
            in_XMM11 = packssdw(auVar276,auVar276);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 5] = uVar66;
            }
            auVar177 = auVar176 & auVar229 | auVar177;
            auVar146 = packssdw(auVar177,auVar177);
            auVar20._8_4_ = 0xffffffff;
            auVar20._0_8_ = 0xffffffffffffffff;
            auVar20._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar20,auVar146 ^ auVar20);
            if ((auVar146 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 6] = uVar66;
            }
            auVar146 = (auVar129 | _DAT_004c9e20) ^ _DAT_004c8280;
            iVar86 = -(uint)(iVar86 < auVar146._0_4_);
            auVar230._4_4_ = -(uint)(iVar87 < auVar146._4_4_);
            iVar251 = -(uint)(iVar251 < auVar146._8_4_);
            auVar230._12_4_ = -(uint)(iVar250 < auVar146._12_4_);
            auVar178._4_4_ = iVar86;
            auVar178._0_4_ = iVar86;
            auVar178._8_4_ = iVar251;
            auVar178._12_4_ = iVar251;
            auVar130._4_4_ = -(uint)(auVar146._4_4_ == iVar87);
            auVar130._12_4_ = -(uint)(auVar146._12_4_ == iVar250);
            auVar130._0_4_ = auVar130._4_4_;
            auVar130._8_4_ = auVar130._12_4_;
            auVar230._0_4_ = auVar230._4_4_;
            auVar230._8_4_ = auVar230._12_4_;
            auVar146 = auVar130 & auVar178 | auVar230;
            auVar146 = packssdw(auVar146,auVar146);
            auVar21._8_4_ = 0xffffffff;
            auVar21._0_8_ = 0xffffffffffffffff;
            auVar21._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 ^ auVar21,auVar146 ^ auVar21);
            if ((auVar146 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 7] = uVar66;
            }
            auVar267 = pshufhw(auVar178,auVar178,0x84);
            auVar146 = pshufhw(auVar130,auVar130,0x84);
            auVar286 = pshufhw(auVar267,auVar230,0x84);
            auVar22._8_4_ = 0xffffffff;
            auVar22._0_8_ = 0xffffffffffffffff;
            auVar22._12_4_ = 0xffffffff;
            auVar146 = packssdw(auVar146 & auVar267,(auVar286 | auVar146 & auVar267) ^ auVar22);
            if ((auVar146 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (&local_9da)[uVar73 + uVar98 + 8] = uVar66;
            }
            uVar98 = uVar98 + 8;
          } while (((long)iVar81 + 7U & 0xfffffffffffffff8) != uVar98);
        }
      }
    }
    puVar76 = left_data_2 + 0x10;
    if ((filter_intra_mode != '\x05') || (bVar64 != 0)) {
      if ((iVar69 < 1) || (iVar120 < 1)) {
        if ((iVar69 < 1) && (puVar70 = puVar92, iVar120 < 1)) {
          local_9da = (uint16_t)iVar68;
        }
        else {
          local_9da = *puVar70;
        }
      }
      else {
        local_9da = puVar70[-1];
      }
      left_data_2[0xf] = local_9da;
      if (filter_intra_mode != '\x05') {
        uVar91 = 1;
        if (1 < (int)uVar78) {
          uVar91 = (ulong)uVar78;
        }
        lVar105 = 0;
        do {
          left_data[lVar105 + 0x21] = *puVar76;
          lVar105 = lVar105 + 0x21;
          puVar76 = puVar76 + 1;
        } while (uVar91 * 0x21 != lVar105);
        memcpy(left_data,&local_9da,__n * 2 + 2);
        lVar105 = (ulong)filter_intra_mode * 0x40;
        lVar72 = 1;
        do {
          lVar74 = lVar72 + -1;
          lVar95 = 1;
          do {
            uVar79 = (&uStack_8ba)[lVar74 * 0x21 + lVar95];
            uVar4 = left_data[lVar74 * 0x21 + lVar95];
            uVar5 = left_data[lVar74 * 0x21 + lVar95 + 1];
            uVar6 = left_data[lVar74 * 0x21 + lVar95 + 2];
            uVar7 = left_data[lVar74 * 0x21 + lVar95 + 3];
            uVar8 = (&uStack_8ba)[lVar72 * 0x21 + lVar95];
            uVar9 = (&uStack_8ba)[(lVar72 + 1) * 0x21 + lVar95];
            uVar73 = 0;
            do {
              uVar78 = (int)((int)*(char *)(lVar105 + 0x54f7a6 + uVar73 * 8) * (uint)uVar9 +
                             (int)*(char *)(lVar105 + 0x54f7a5 + uVar73 * 8) * (uint)uVar8 +
                             (int)*(char *)(lVar105 + 0x54f7a4 + uVar73 * 8) * (uint)uVar7 +
                             (int)*(char *)(lVar105 + 0x54f7a3 + uVar73 * 8) * (uint)uVar6 +
                             (int)*(char *)(lVar105 + 0x54f7a2 + uVar73 * 8) * (uint)uVar5 +
                             (int)*(char *)(lVar105 + 0x54f7a1 + uVar73 * 8) * (uint)uVar4 +
                             (int)av1_filter_intra_taps[filter_intra_mode][uVar73][0] * (uint)uVar79
                            + 8) >> 4;
              uVar104 = uVar78;
              if (iVar85 == 10) {
                if (0x3fe < uVar78) {
                  uVar104 = 0x3ff;
                }
              }
              else if (iVar85 == 0xc) {
                if (0xffe < uVar78) {
                  uVar104 = 0xfff;
                }
              }
              else if (0xfe < uVar78) {
                uVar104 = 0xff;
              }
              uVar66 = (uint16_t)uVar104;
              if ((int)uVar78 < 0) {
                uVar66 = 0;
              }
              left_data[(ulong)(((uint)(uVar73 >> 2) & 0x3fffffff) + (int)lVar72) * 0x21 +
                        (ulong)(((uint)uVar73 & 3) + (int)lVar95)] = uVar66;
              uVar73 = uVar73 + 1;
            } while (uVar73 != 8);
            lVar95 = lVar95 + 4;
          } while (lVar95 <= (long)__n);
          lVar72 = lVar72 + 2;
        } while (lVar72 <= (long)__n_01);
        lVar105 = 0;
        do {
          memcpy(dst,(void *)((long)left_data + lVar105 + 0x44),__n * 2);
          lVar105 = lVar105 + 0x42;
          dst = (uint8_t *)((long)dst + (long)dst_stride * 2);
        } while (uVar91 * 0x42 != lVar105);
        return;
      }
    }
    if (enable_intra_edge_filter == 0) {
      uVar80 = 0;
      uVar101 = 0;
    }
    else {
      if ((uVar103 != 0x5a) && (uVar103 != 0xb4)) {
        if ((bVar108 != 0) && ((bVar65 != 0 && (0x17 < (int)(uVar104 + uVar78))))) {
          left_data_2[0xf] =
               (uint16_t)
               (((uint)local_9d8 + (uint)left_data_2[0x10]) * 5 +
                ((uint)local_9da + (uint)local_9da * 2) * 2 + 8 >> 4);
          local_9da = left_data_2[0xf];
        }
        if ((0 < iVar69) && (bVar108 != 0)) {
          iVar68 = intra_edge_filter_strength(uVar104,uVar78,uVar103 - 0x5a,uVar77);
          uVar101 = 0;
          if ((int)uVar103 < 0x5a) {
            uVar101 = uVar78;
          }
          (*av1_highbd_filter_intra_edge)(&local_9da,iVar69 + 1 + uVar101,iVar68);
        }
        if ((0 < iVar120) && (bVar65 != 0)) {
          iVar68 = intra_edge_filter_strength(uVar78,uVar104,uVar103 - 0xb4,uVar77);
          uVar101 = 0;
          if (0xb4 < (int)uVar103) {
            uVar101 = uVar104;
          }
          (*av1_highbd_filter_intra_edge)(left_data_2 + 0xf,iVar120 + 1 + uVar101,iVar68);
        }
      }
      uVar93 = uVar103 - 0x5a;
      uVar80 = 0;
      uVar96 = -uVar93;
      if (0 < (int)uVar93) {
        uVar96 = uVar93;
      }
      uVar101 = 0;
      if ((uVar93 != 0) && (uVar101 = 0, uVar96 < 0x28)) {
        iVar68 = (uint)(uVar77 == 0) * 8 + 9;
        uVar101 = (uint)((int)(uVar104 + uVar78) < iVar68);
        if ((bVar108 != 0) && ((int)(uVar104 + uVar78) < iVar68)) {
          uVar101 = 0;
          if ((int)uVar103 < 0x5a) {
            uVar101 = uVar78;
          }
          (*av1_highbd_upsample_intra_edge)(&local_9d8,uVar101 + uVar104,iVar85);
          uVar101 = 1;
        }
      }
      uVar93 = uVar103 - 0xb4;
      uVar96 = -uVar93;
      if (0 < (int)uVar93) {
        uVar96 = uVar93;
      }
      if ((uVar93 != 0) && (uVar96 < 0x28)) {
        iVar68 = (uint)(uVar77 == 0) * 8 + 9;
        uVar80 = (uint)((int)(uVar104 + uVar78) < iVar68);
        if ((bVar65 != 0) && ((int)(uVar104 + uVar78) < iVar68)) {
          uVar80 = 0;
          if (0xb4 < (int)uVar103) {
            uVar80 = uVar104;
          }
          (*av1_highbd_upsample_intra_edge)(puVar76,uVar80 + uVar78,iVar85);
          uVar80 = 1;
        }
      }
    }
    lVar105 = (long)dst_stride;
    if (uVar103 - 1 < 0x59) {
      iVar68 = (int)dr_intra_derivative[local_ba0];
      puVar92 = &local_9d8;
      iVar69 = 1;
      pp_Var99 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
                 &av1_highbd_dr_prediction_z1;
      goto LAB_003a262f;
    }
    if (uVar103 - 0x5b < 0x59) {
      (*av1_highbd_dr_prediction_z2)
                ((uint16_t *)dst,lVar105,uVar104,uVar78,&local_9d8,puVar76,uVar101,uVar80,
                 (int)dr_intra_derivative[0xb4 - uVar103],(int)dr_intra_derivative[uVar103 - 0x5a],
                 iVar85);
      return;
    }
    if (0x58 < uVar103 - 0xb5) {
      if (uVar103 == 0xb4) {
        (*pred_high[2][uVar91])((uint16_t *)dst,lVar105,&local_9d8,puVar76,iVar85);
        return;
      }
      if (uVar103 != 0x5a) {
        return;
      }
      (*pred_high[1][uVar91])((uint16_t *)dst,lVar105,&local_9d8,puVar76,iVar85);
      return;
    }
    sVar3 = dr_intra_derivative[0x10e - uVar103];
    puVar92 = &local_9d8;
    pp_Var99 = (_func_void_uint8_t_ptr_ptrdiff_t_int_int_uint8_t_ptr_uint8_t_ptr_int_int_int **)
               &av1_highbd_dr_prediction_z3;
    uVar101 = uVar80;
  }
  iVar69 = (int)sVar3;
  iVar68 = 1;
LAB_003a262f:
  (**pp_Var99)((uint16_t *)dst,(long)dst_stride,uVar104,uVar78,puVar92,puVar76,uVar101,iVar68,iVar69
               ,iVar85);
  return;
}

Assistant:

void av1_predict_intra_block(const MACROBLOCKD *xd, BLOCK_SIZE sb_size,
                             int enable_intra_edge_filter, int wpx, int hpx,
                             TX_SIZE tx_size, PREDICTION_MODE mode,
                             int angle_delta, int use_palette,
                             FILTER_INTRA_MODE filter_intra_mode,
                             const uint8_t *ref, int ref_stride, uint8_t *dst,
                             int dst_stride, int col_off, int row_off,
                             int plane) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  const int x = col_off << MI_SIZE_LOG2;
  const int y = row_off << MI_SIZE_LOG2;
  const int is_hbd = is_cur_buf_hbd(xd);

  assert(mode < INTRA_MODES);

  if (use_palette) {
    int r, c;
    const uint8_t *const map = xd->plane[plane != 0].color_index_map +
                               xd->color_index_map_offset[plane != 0];
    const uint16_t *const palette =
        mbmi->palette_mode_info.palette_colors + plane * PALETTE_MAX_SIZE;
    if (is_hbd) {
      uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst16[r * dst_stride + c] = palette[map[(r + y) * wpx + c + x]];
        }
      }
    } else {
      for (r = 0; r < txhpx; ++r) {
        for (c = 0; c < txwpx; ++c) {
          dst[r * dst_stride + c] =
              (uint8_t)palette[map[(r + y) * wpx + c + x]];
        }
      }
    }
    return;
  }

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const int have_top =
      row_off || (ss_y ? xd->chroma_up_available : xd->up_available);
  const int have_left =
      col_off || (ss_x ? xd->chroma_left_available : xd->left_available);

  // Distance between the right edge of this prediction block to
  // the frame right edge
  const int xr = (xd->mb_to_right_edge >> (3 + ss_x)) + wpx - x - txwpx;
  // Distance between the bottom edge of this prediction block to
  // the frame bottom edge
  const int yd = (xd->mb_to_bottom_edge >> (3 + ss_y)) + hpx - y - txhpx;
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  const int is_dr_mode = av1_is_directional_mode(mode);

  // The computations in this function, as well as in build_intra_predictors(),
  // are generalized for all intra modes. Some of these operations are not
  // required since non-directional intra modes (i.e., DC, SMOOTH, SMOOTH_H,
  // SMOOTH_V, and PAETH) specifically require left and top neighbors. Hence, a
  // separate function build_non_directional_intra_predictors() is introduced
  // for these modes to avoid redundant computations while generating pred data.

  const int n_top_px = have_top ? AOMMIN(txwpx, xr + txwpx) : 0;
  const int n_left_px = have_left ? AOMMIN(txhpx, yd + txhpx) : 0;
  if (!use_filter_intra && !is_dr_mode) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_hbd) {
      highbd_build_non_directional_intra_predictors(
          ref, ref_stride, dst, dst_stride, mode, tx_size, n_top_px, n_left_px,
          xd->bd);
      return;
    }
#endif  // CONFIG_AV1_HIGHBITDEPTH
    build_non_directional_intra_predictors(ref, ref_stride, dst, dst_stride,
                                           mode, tx_size, n_top_px, n_left_px);
    return;
  }

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  const int right_available =
      mi_col + ((col_off + txw) << ss_x) < xd->tile.mi_col_end;
  const int bottom_available =
      (yd > 0) && (mi_row + ((row_off + txh) << ss_y) < xd->tile.mi_row_end);

  const PARTITION_TYPE partition = mbmi->partition;

  BLOCK_SIZE bsize = mbmi->bsize;
  // force 4x4 chroma component block size.
  if (ss_x || ss_y) {
    bsize = scale_chroma_bsize(bsize, ss_x, ss_y);
  }

  int p_angle = 0;
  int need_top_right = extend_modes[mode] & NEED_ABOVERIGHT;
  int need_bottom_left = extend_modes[mode] & NEED_BOTTOMLEFT;

  if (use_filter_intra) {
    need_top_right = 0;
    need_bottom_left = 0;
  }
  if (is_dr_mode) {
    p_angle = mode_to_angle_map[mode] + angle_delta;
    need_top_right = p_angle < 90;
    need_bottom_left = p_angle > 180;
  }

  // Possible states for have_top_right(TR) and have_bottom_left(BL)
  // -1 : TR and BL are not needed
  //  0 : TR and BL are needed but not available
  // > 0 : TR and BL are needed and pixels are available
  const int have_top_right =
      need_top_right ? has_top_right(sb_size, bsize, mi_row, mi_col, have_top,
                                     right_available, partition, tx_size,
                                     row_off, col_off, ss_x, ss_y)
                     : -1;
  const int have_bottom_left =
      need_bottom_left ? has_bottom_left(sb_size, bsize, mi_row, mi_col,
                                         bottom_available, have_left, partition,
                                         tx_size, row_off, col_off, ss_x, ss_y)
                       : -1;

  const int disable_edge_filter = !enable_intra_edge_filter;
  const int intra_edge_filter_type = get_intra_edge_filter_type(xd, plane);
  const int n_topright_px =
      have_top_right > 0 ? AOMMIN(txwpx, xr) : have_top_right;
  const int n_bottomleft_px =
      have_bottom_left > 0 ? AOMMIN(txhpx, yd) : have_bottom_left;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_hbd) {
    highbd_build_directional_and_filter_intra_predictors(
        ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
        tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
        n_bottomleft_px, intra_edge_filter_type, xd->bd);
    return;
  }
#endif
  build_directional_and_filter_intra_predictors(
      ref, ref_stride, dst, dst_stride, mode, p_angle, filter_intra_mode,
      tx_size, disable_edge_filter, n_top_px, n_topright_px, n_left_px,
      n_bottomleft_px, intra_edge_filter_type);
}